

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void rollback_prior_to_ops(bool walflush)

{
  bool bVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar8;
  __atomic_base<unsigned_long> metalen;
  uint extraout_EDX;
  long extraout_RDX;
  long extraout_RDX_00;
  fdb_commit_opt_t opt;
  long lVar9;
  ulong uVar10;
  fdb_kvs_handle *pfVar11;
  code *pcVar12;
  fdb_doc *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fconfig_00;
  timeval *ptVar14;
  timeval *__tv;
  fdb_config *fconfig_01;
  fdb_kvs_handle **ppfVar15;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar16;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *__s;
  char *__s_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar17;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar18;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar19;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar20;
  uint uVar21;
  undefined7 in_register_00000039;
  fdb_file_handle *pfVar22;
  fdb_kvs_config *pfVar23;
  fdb_kvs_handle **ppfVar24;
  ulong uVar25;
  fdb_doc **doc;
  btree *doc_00;
  char cVar26;
  uint uVar27;
  uint64_t *doc_01;
  long lVar28;
  char *pcVar29;
  fdb_kvs_config *config;
  char *pcVar30;
  uint *puVar31;
  fdb_config *fconfig_02;
  fdb_kvs_handle **ppfVar32;
  char *pcVar33;
  kvs_ops_stat *pkVar34;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar35;
  fdb_doc *doc_02;
  fdb_doc *pfVar36;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 doc_03;
  fdb_kvs_handle *pfVar37;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *mirror_kv1;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_iterator *it;
  fdb_doc *vdoc;
  fdb_kvs_config kvs_config;
  fdb_kvs_info info;
  timeval __test_begin;
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  fdb_kvs_handle *pfStack_5cf0;
  fdb_kvs_handle *pfStack_5ce8;
  fdb_file_handle *pfStack_5ce0;
  fdb_iterator *pfStack_5cd8;
  fdb_doc *pfStack_5cd0;
  fdb_kvs_handle *pfStack_5cc8;
  timeval tStack_5cc0;
  fdb_kvs_config fStack_5cb0;
  fdb_config fStack_5c98;
  fdb_config *pfStack_5ba0;
  fdb_kvs_handle *pfStack_5b98;
  fdb_kvs_handle *pfStack_5b90;
  fdb_file_handle *pfStack_5b88;
  fdb_kvs_handle *pfStack_5b80;
  char acStack_5b77 [15];
  filemgr *pfStack_5b68;
  docio_handle *pdStack_5b60;
  btreeblk_handle *pbStack_5b58;
  size_t sStack_5b50;
  filemgr *pfStack_5b48;
  docio_handle *pdStack_5b40;
  btreeblk_handle *pbStack_5b38;
  timeval tStack_5b30;
  undefined1 auStack_5b20 [76];
  uint uStack_5ad4;
  char *pcStack_59e0;
  atomic<unsigned_long> aStack_59d8;
  btree *pbStack_59d0;
  fdb_kvs_handle *pfStack_59c8;
  fdb_kvs_handle *pfStack_59c0;
  code *pcStack_59b8;
  uint uStack_59a4;
  fdb_txn *pfStack_59a0;
  fdb_kvs_handle *pfStack_5998;
  fdb_iterator *pfStack_5990;
  fdb_snapshot_info_t *pfStack_5988;
  int iStack_597c;
  fdb_kvs_handle *pfStack_5978;
  fdb_kvs_handle *apfStack_5970 [3];
  uint64_t uStack_5958;
  fdb_kvs_config fStack_5950;
  char acStack_5938 [8];
  timeval tStack_5930;
  char acStack_5920 [256];
  btree bStack_5820;
  char acStack_57d0 [256];
  char acStack_56d0 [256];
  fdb_config fStack_55d0;
  fdb_kvs_handle **ppfStack_54d8;
  fdb_kvs_handle **ppfStack_54d0;
  fdb_kvs_handle *pfStack_54c8;
  fdb_kvs_handle **ppfStack_54c0;
  fdb_kvs_handle *pfStack_54b8;
  code *pcStack_54b0;
  fdb_kvs_handle **ppfStack_54a8;
  fdb_kvs_handle *pfStack_54a0;
  fdb_kvs_handle *apfStack_5498 [9];
  fdb_kvs_config fStack_5450;
  timeval tStack_5438;
  fdb_kvs_handle *apfStack_5428 [33];
  fdb_config fStack_5320;
  fdb_kvs_handle *apfStack_5228 [32];
  fdb_kvs_handle *apfStack_5128 [32];
  fdb_kvs_handle afStack_5028 [15];
  fdb_config *pfStack_3020;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3018;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3010;
  fdb_config *pfStack_3008;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3000;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2ff8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2fe8;
  fdb_file_handle *pfStack_2fe0;
  fdb_iterator *pfStack_2fd8;
  fdb_doc *pfStack_2fd0;
  fdb_kvs_handle *pfStack_2fc8;
  undefined1 auStack_2fbf [15];
  timeval tStack_2fb0;
  undefined1 auStack_2fa0 [72];
  fdb_config fStack_2f58;
  timeval *ptStack_2e60;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2e58;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2e50;
  fdb_config *pfStack_2e48;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2e40;
  int iStack_2e2c;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2e28;
  fdb_file_handle *pfStack_2e20;
  pthread_t pStack_2e18;
  char acStack_2e0f [15];
  void *pvStack_2e00;
  char *pcStack_2df8;
  fdb_config *pfStack_2df0;
  uint64_t uStack_2de8;
  timeval tStack_2de0;
  undefined1 auStack_2dd0 [16];
  uint64_t uStack_2dc0;
  fdb_config fStack_2cd8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2bd8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2bd0;
  uint *puStack_2bc8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2bc0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2bb8;
  timeval tStack_2ba8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b98;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b90;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b80;
  fdb_kvs_handle *pfStack_2b78;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b70;
  fdb_file_handle *pfStack_2b68;
  uint uStack_2b5c;
  fdb_kvs_config afStack_2b58 [2];
  timeval tStack_2b18;
  fdb_kvs_config fStack_2b08;
  fdb_kvs_info fStack_2ae8;
  undefined1 auStack_2ab8 [32];
  undefined1 uStack_2a98;
  undefined1 uStack_2a8a;
  undefined8 uStack_2a80;
  code *pcStack_2a60;
  undefined4 uStack_2a58;
  uint *puStack_2a50;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_29c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_29b8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_29b0;
  hbtrie_func_readkey *phStack_29a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_29a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2998;
  fdb_file_handle *pfStack_2988;
  uint uStack_297c;
  fdb_kvs_handle *pfStack_2978;
  fdb_kvs_handle *pfStack_2970;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2968;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_2960 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2938;
  char acStack_2930 [8];
  fdb_kvs_config fStack_2928;
  fdb_kvs_info fStack_2910;
  timeval tStack_28e0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_28d0 [5];
  btree *apbStack_28a8 [5];
  btree *apbStack_2880 [5];
  btree *apbStack_2858 [4];
  fdb_doc *pfStack_2838;
  char acStack_2830 [256];
  char acStack_2730 [256];
  char acStack_2630 [256];
  fdb_config fStack_2530;
  fdb_doc *pfStack_2438;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2430;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2428;
  fdb_kvs_config *pfStack_2420;
  fdb_doc *pfStack_2418;
  code *pcStack_2410;
  undefined1 auStack_23f8 [36];
  undefined4 uStack_23d4;
  fdb_kvs_handle *pfStack_23d0;
  fdb_doc **ppfStack_23c8;
  timeval tStack_23c0;
  fdb_kvs_config fStack_23b0;
  fdb_doc afStack_2398 [3];
  char acStack_2298 [256];
  char acStack_2198 [264];
  fdb_config fStack_2090;
  fdb_doc *pfStack_1f98;
  size_t *psStack_1f90;
  fdb_doc afStack_1ae8 [15];
  fdb_kvs_handle *pfStack_1630;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1628;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1620;
  char *pcStack_1618;
  char *pcStack_1610;
  code *pcStack_1608;
  fdb_kvs_handle *pfStack_15f8;
  int iStack_15ec;
  fdb_kvs_handle *pfStack_15e8;
  undefined1 auStack_15e0 [232];
  char acStack_14f8 [8];
  char acStack_14f0 [64];
  timeval tStack_14b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_14a0 [5];
  btree *apbStack_1478 [5];
  btree *apbStack_1450 [5];
  btree *apbStack_1428 [5];
  fdb_config fStack_1400;
  fdb_kvs_info *pfStack_1308;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1300;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_12f8;
  fdb_kvs_handle **ppfStack_12f0;
  fdb_kvs_handle **ppfStack_12e8;
  code *pcStack_12e0;
  fdb_file_handle *pfStack_12c8;
  uint uStack_12bc;
  fdb_kvs_handle *apfStack_12b8 [4];
  fdb_kvs_info fStack_1298;
  fdb_kvs_config fStack_1268;
  char acStack_1250 [8];
  timeval tStack_1248;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1238 [5];
  btree *apbStack_1210 [5];
  btree *apbStack_11e8 [5];
  btree *apbStack_11c0 [5];
  char acStack_1198 [256];
  char acStack_1098 [256];
  char acStack_f98 [256];
  fdb_config fStack_e98;
  fdb_kvs_handle *pfStack_da0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_d98;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_d90;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_d88;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_d80;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_d78;
  uint uStack_d64;
  uint uStack_d60;
  uint uStack_d5c;
  fdb_kvs_handle *pfStack_d58;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_d50;
  long lStack_d48;
  fdb_kvs_handle *pfStack_d40;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_d38;
  size_t sStack_d30;
  fdb_kvs_handle *pfStack_d28;
  timeval tStack_d20;
  fdb_kvs_handle fStack_d10;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ad8;
  char *pcStack_ad0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ac8;
  code *pcStack_ab0;
  undefined1 auStack_aa8 [104];
  fdb_kvs_config fStack_a40;
  fdb_config fStack_a28;
  char acStack_930 [256];
  kvs_info akStack_830 [11];
  ulong uStack_728;
  char *pcStack_720;
  fdb_doc **ppfStack_718;
  uint64_t *puStack_710;
  fdb_kvs_info *pfStack_708;
  code *pcStack_700;
  fdb_kvs_handle *local_6f0;
  fdb_kvs_handle *local_6e8;
  fdb_doc *local_6e0;
  fdb_file_handle *local_6d8;
  fdb_iterator *local_6d0;
  uint local_6c4;
  undefined1 local_6c0 [40];
  fdb_kvs_info local_698;
  timeval local_668;
  fdb_doc *local_658 [100];
  char local_338 [264];
  fdb_config local_230;
  char local_138 [264];
  
  pcStack_700 = (code *)0x1193cc;
  gettimeofday(&local_668,(__timezone_ptr_t)0x0);
  pcStack_700 = (code *)0x1193d1;
  memleak_start();
  pcStack_700 = (code *)0x1193e1;
  fdb_get_default_config();
  pcStack_700 = (code *)0x1193ee;
  fdb_get_default_kvs_config();
  local_6e0 = (fdb_doc *)0x0;
  pcStack_700 = (code *)0x119403;
  system("rm -rf  mvcc_test* > errorlog.txt");
  local_230.wal_threshold = 0x400;
  local_230.seqtree_opt = '\x01';
  local_230.flags = 1;
  local_230.compaction_threshold = '\n';
  local_230.purging_interval = 1;
  pcStack_700 = (code *)0x119439;
  fdb_open(&local_6d8,"./mvcc_test1",&local_230);
  pcStack_700 = (code *)0x119451;
  fdb_kvs_open(local_6d8,&local_6f0,"kv1",(fdb_kvs_config *)(local_6c0 + 0x10));
  local_6c4 = (uint)CONCAT71(in_register_00000039,walflush);
  if (local_6c4 == 0) {
    pcVar33 = "mirror";
  }
  else {
    pcVar33 = (char *)0x0;
  }
  pcStack_700 = (code *)0x119481;
  fdb_kvs_open(local_6d8,&local_6e8,pcVar33,(fdb_kvs_config *)(local_6c0 + 0x10));
  lVar9 = 0;
  uVar25 = 0;
  do {
    pcStack_700 = (code *)0x1194a5;
    sprintf(local_338,"key%d",uVar25 & 0xffffffff);
    pcStack_700 = (code *)0x1194b8;
    sVar5 = strlen(local_338);
    pcStack_700 = (code *)0x1194d6;
    fdb_doc_create((fdb_doc **)((long)local_658 + lVar9),local_338,sVar5,(void *)0x0,0,(void *)0x0,0
                  );
    pcStack_700 = (code *)0x1194e8;
    fdb_set(local_6f0,local_658[uVar25]);
    pcStack_700 = (code *)0x1194fa;
    fdb_set(local_6e8,local_658[uVar25]);
    uVar25 = uVar25 + 1;
    lVar9 = lVar9 + 8;
  } while (uVar25 != 100);
  lVar9 = 0;
  pcStack_700 = (code *)0x119515;
  fdb_commit(local_6d8,'\0');
  do {
    pcStack_700 = (code *)0x119527;
    fdb_del(local_6f0,local_658[lVar9]);
    pcStack_700 = (code *)0x119539;
    fdb_del(local_6e8,local_658[lVar9]);
    pcStack_700 = (code *)0x119546;
    fdb_doc_free(local_658[lVar9]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x32);
  lVar9 = 0;
  do {
    pcStack_700 = (code *)0x11955e;
    fdb_doc_free(local_658[lVar9 + 0x32]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x32);
  pcStack_700 = (code *)0x119573;
  fdb_commit(local_6d8,'\0');
  pcStack_700 = (code *)0x119582;
  fdb_get_kvs_info(local_6f0,&local_698);
  if (local_698.doc_count != 0x32) {
    pcStack_700 = (code *)0x119592;
    rollback_prior_to_ops();
  }
  local_6c0._8_8_ = local_698.last_seqnum;
  pcVar33 = "key%d";
  doc_01 = (uint64_t *)0x0;
  do {
    uVar25 = 100;
    lVar9 = 0;
    do {
      pcStack_700 = (code *)0x1195c4;
      sprintf(local_338,"key%d",uVar25);
      doc = (fdb_doc **)((long)local_658 + lVar9);
      pcStack_700 = (code *)0x1195d7;
      sVar5 = strlen(local_338);
      pcStack_700 = (code *)0x1195f5;
      fdb_doc_create(doc,local_338,sVar5,(void *)0x0,0,(void *)0x0,0);
      pcStack_700 = (code *)0x119603;
      fdb_set(local_6f0,*doc);
      pcStack_700 = (code *)0x119611;
      fdb_del(local_6f0,*doc);
      pcStack_700 = (code *)0x11961a;
      fdb_doc_free(*doc);
      uVar25 = (ulong)((int)uVar25 + 1);
      lVar9 = lVar9 + 8;
    } while (lVar9 != 800);
    uVar27 = (int)doc_01 + 1;
    doc_01 = (uint64_t *)(ulong)uVar27;
  } while (uVar27 != 100);
  uVar10 = (ulong)local_6c4;
  opt = (fdb_commit_opt_t)local_6c4;
  pcStack_700 = (code *)0x119647;
  fdb_commit(local_6d8,opt);
  pcStack_700 = (code *)0x119656;
  fVar2 = fdb_rollback(&local_6f0,(long)(int)local_6c0._8_4_);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_700 = (code *)0x119670;
    fdb_get_kvs_info(local_6f0,&local_698);
    doc_01 = &local_698.doc_count;
    if (local_698.doc_count != 0x32) {
      pcStack_700 = (code *)0x119684;
      rollback_prior_to_ops();
    }
    pcVar33 = (char *)&local_698;
    pcStack_700 = (code *)0x119696;
    fdb_get_kvs_info(local_6e8,(fdb_kvs_info *)pcVar33);
    if (local_698.doc_count != 0x32) {
      pcStack_700 = (code *)0x1196a5;
      rollback_prior_to_ops();
    }
    pcStack_700 = (code *)0x1196bb;
    fVar2 = fdb_iterator_sequence_init(local_6e8,&local_6d0,0,0,0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      doc_01 = (uint64_t *)&local_6e0;
      pcVar33 = local_6c0;
      while( true ) {
        pcStack_700 = (code *)0x1196da;
        fVar2 = fdb_iterator_get_metaonly(local_6d0,(fdb_doc **)doc_01);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pcStack_700 = (code *)0x11970a;
        fdb_doc_create((fdb_doc **)pcVar33,local_6e0->key,local_6e0->keylen,local_6e0->meta,
                       local_6e0->metalen,local_6e0->body,local_6e0->bodylen);
        pcStack_700 = (code *)0x119719;
        fVar2 = fdb_get(local_6f0,(fdb_doc *)local_6c0._0_8_);
        if (local_6e0->deleted == true) {
          if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00119809;
        }
        else if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119804;
        pcStack_700 = (code *)0x11973b;
        fdb_doc_free(local_6e0);
        local_6e0 = (fdb_doc *)0x0;
        pcStack_700 = (code *)0x11974e;
        fdb_doc_free((fdb_doc *)local_6c0._0_8_);
        pcStack_700 = (code *)0x119758;
        fVar2 = fdb_iterator_next(local_6d0);
        if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
          pcStack_700 = (code *)0x11976b;
          fdb_iterator_close(local_6d0);
          pcStack_700 = (code *)0x119775;
          fdb_kvs_close(local_6e8);
          pcStack_700 = (code *)0x11977f;
          fdb_kvs_close(local_6f0);
          pcStack_700 = (code *)0x119789;
          fdb_close(local_6d8);
          pcStack_700 = (code *)0x11978e;
          fdb_shutdown();
          pcStack_700 = (code *)0x119793;
          memleak_end();
          pcVar33 = "normal commit:";
          if (opt != '\0') {
            pcVar33 = "commit with wal flush:";
          }
          pcStack_700 = (code *)0x1197c0;
          sprintf(local_138,"rollback prior to ops test %s",pcVar33);
          pcVar33 = "%s PASSED\n";
          if (rollback_prior_to_ops(bool)::__test_pass != '\0') {
            pcVar33 = "%s FAILED\n";
          }
          pcStack_700 = (code *)0x1197ed;
          fprintf(_stderr,pcVar33,local_138);
          return;
        }
      }
      pcStack_700 = (code *)0x119804;
      rollback_prior_to_ops();
LAB_00119804:
      pcStack_700 = (code *)0x119809;
      rollback_prior_to_ops();
LAB_00119809:
      pcStack_700 = (code *)0x11980e;
      rollback_prior_to_ops();
      goto LAB_0011980e;
    }
  }
  else {
LAB_0011980e:
    pcStack_700 = (code *)0x119813;
    rollback_prior_to_ops();
  }
  pcStack_700 = snapshot_concurrent_compaction_test;
  rollback_prior_to_ops();
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x119835;
  uStack_728 = uVar10;
  pcStack_720 = local_338;
  ppfStack_718 = doc;
  puStack_710 = doc_01;
  pfStack_708 = (fdb_kvs_info *)pcVar33;
  pcStack_700 = (code *)uVar25;
  gettimeofday((timeval *)(auStack_aa8 + 0x58),(__timezone_ptr_t)0x0);
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x11983a;
  memleak_start();
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x119847;
  fdb_get_default_config();
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x119854;
  fdb_get_default_kvs_config();
  fStack_a28.compaction_cb_ctx = auStack_aa8 + 0x38;
  auStack_aa8._56_8_ = (btree *)0x0;
  auStack_aa8._64_8_ = (btree *)0x0;
  auStack_aa8._72_8_ = (filemgr *)0x0;
  fStack_a28.wal_threshold = 0x80;
  fStack_a28.flags = 1;
  fStack_a28.compaction_cb = cb_snapshot;
  fStack_a28.compaction_cb_mask = 0x11;
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x11989d;
  system("rm -rf  mvcc_test* > errorlog.txt");
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x1198b2;
  fdb_open((fdb_file_handle **)(auStack_aa8 + 0x28),"./mvcc_test1",&fStack_a28);
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x1198cc;
  fdb_kvs_open((fdb_file_handle *)auStack_aa8._40_8_,(fdb_kvs_handle **)(auStack_aa8 + 0x30),"db",
               &fStack_a40);
  auStack_aa8._56_8_ = auStack_aa8._48_8_;
  pkVar34 = (kvs_ops_stat *)0x1;
  uVar25 = 0;
  do {
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x11990b;
    sprintf((char *)akStack_830,"key%04d",uVar25);
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119921;
    sprintf(acStack_930,"body%04d_update%d",uVar25,uVar25 / 0x32);
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_aa8._48_8_;
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x11992e;
    sVar5 = strlen((char *)akStack_830);
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x11993a;
    sVar6 = strlen(acStack_930);
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x11994f;
    aVar8 = handle_00;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,akStack_830,(size_t)(sVar5 + 1),
                       acStack_930,sVar6 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      auStack_aa8._32_8_ = (kvs_ops_stat *)0x119a29;
      snapshot_concurrent_compaction_test();
LAB_00119a29:
      auStack_aa8._32_8_ = (kvs_ops_stat *)0x119a2e;
      snapshot_concurrent_compaction_test();
      goto LAB_00119a2e;
    }
    if ((int)((ulong)pkVar34 / 0x32) * 0x32 + -1 == (int)uVar25) {
      auStack_aa8._32_8_ = (kvs_ops_stat *)0x119979;
      aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_aa8._40_8_;
      fVar2 = fdb_commit((fdb_file_handle *)auStack_aa8._40_8_,'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119a29;
    }
    uVar27 = (int)uVar25 + 1;
    uVar25 = (ulong)uVar27;
    pkVar34 = (kvs_ops_stat *)(ulong)((int)pkVar34 + 1);
  } while (uVar27 != 100);
  auStack_aa8._64_8_ = (btree *)0x200000064;
  auStack_aa8._72_4_ = 10;
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x1199ba;
  _snapshot_check((fdb_kvs_handle *)auStack_aa8._48_8_,100,2);
  auStack_aa8._32_8_ = (kvs_ops_stat *)0x1199ca;
  aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_aa8._40_8_;
  fVar2 = fdb_compact((fdb_file_handle *)auStack_aa8._40_8_,"./mvcc_test2");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x1199d7;
    fdb_close((fdb_file_handle *)auStack_aa8._40_8_);
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x1199dc;
    fdb_shutdown();
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x1199e1;
    memleak_end();
    pcVar33 = "%s PASSED\n";
    if (snapshot_concurrent_compaction_test()::__test_pass != '\0') {
      pcVar33 = "%s FAILED\n";
    }
    auStack_aa8._32_8_ = (kvs_ops_stat *)0x119a12;
    fprintf(_stderr,pcVar33,"snapshot with concurrent compaction test");
    return;
  }
LAB_00119a2e:
  auStack_aa8._32_8_ = cb_snapshot;
  snapshot_concurrent_compaction_test();
  pfVar11 = (fdb_kvs_handle *)auStack_aa8;
  uVar10 = 0;
  pcStack_ab0 = (code *)0x119a51;
  auStack_aa8._16_8_ = (void *)(sVar5 + 1);
  auStack_aa8._24_8_ = akStack_830;
  auStack_aa8._32_8_ = pkVar34;
  gettimeofday((timeval *)auStack_aa8,(__timezone_ptr_t)0x0);
  iVar4 = *(int *)(auStack_aa8._48_8_ + 0x10);
  *(int *)(auStack_aa8._48_8_ + 0x10) = iVar4 + -1;
  if (iVar4 < 1) {
    return;
  }
  if (extraout_RDX == 0) {
    pcStack_ab0 = (code *)0x119a71;
    _snapshot_check((fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)auStack_aa8._48_8_)->seqtree,
                    (int)*(bid_t *)(auStack_aa8._48_8_ + 8),
                    *(int *)((long)(auStack_aa8._48_8_ + 8) + 4));
    pcStack_ab0 = (code *)0x119a7c;
    _snapshot_update_docs((fdb_file_handle *)aVar8.seqtree,(cb_snapshot_args *)auStack_aa8._48_8_);
    pcStack_ab0 = (code *)0x119a8a;
    _snapshot_check((fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)auStack_aa8._48_8_)->seqtree,
                    (int)*(bid_t *)(auStack_aa8._48_8_ + 8),
                    *(int *)((long)(auStack_aa8._48_8_ + 8) + 4));
    return;
  }
  pcStack_ab0 = _snapshot_check;
  cb_snapshot();
  aStack_ac8.seqtree = handle_00.seqtree;
  aStack_ad8.seqtree = (btree *)auStack_aa8._48_8_;
  paVar13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
  paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119ac3;
  pcStack_ad0 = acStack_930;
  pcStack_ab0 = (code *)uVar25;
  gettimeofday(&tStack_d20,(__timezone_ptr_t)0x0);
  uStack_d64 = (uint)uVar10;
  uVar27 = (int)(((uint)(uVar10 >> 0x1f) & 1) + uStack_d64) >> 1;
  paVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)uVar27;
  pfVar37 = &fStack_d10;
  paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119ae5;
  pfStack_d40 = pfVar11;
  fdb_get_kvs_info(pfVar11,(fdb_kvs_info *)pfVar37);
  lStack_d48 = (long)(int)uVar27;
  if (fStack_d10.kvs_config.custom_cmp != (fdb_custom_cmp_variable)((int)extraout_EDX * lStack_d48))
  {
    paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c61;
    _snapshot_check();
  }
  paStack_d50 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)extraout_EDX;
  if ((int)extraout_EDX < 1) {
    paStack_d50 = paVar13;
  }
  aVar8.seqtree = (btree *)0x0;
  while( true ) {
    paVar35 = paStack_d50;
    if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)aVar8.seqtree == paStack_d50) {
      return;
    }
    aStack_d38.seqtree = (btree *)&(aVar8.seqtree)->vsize;
    paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119b35;
    pfVar11 = pfStack_d40;
    fVar2 = fdb_snapshot_open(pfStack_d40,&pfStack_d58,(long)aStack_d38.seqtree * lStack_d48);
    uVar21 = (uint)pfVar11;
    pfVar11 = pfVar37;
    __s = paVar16;
    paStack_d88 = paVar13;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    if (0 < (int)uStack_d64) {
      uStack_d60 = aVar8._0_4_;
      uStack_d5c = (uStack_d60 - ((int)(uStack_d60 - 1) >> 0x1f)) - 1 | 1;
      uStack_d60 = uStack_d60 & 0x7ffffffe;
      paVar35 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
      do {
        iVar4 = (int)paVar35;
        if ((int)uVar27 <= iVar4 &&
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)aVar8.seqtree ==
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) break;
        uVar21 = uStack_d5c;
        if (iVar4 < (int)uVar27) {
          uVar21 = uStack_d60;
        }
        __s = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
              &fStack_d10.config.min_block_reuse_filesize;
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119baa;
        sprintf((char *)__s,"key%04d",paVar35);
        handle_00.seqtree = (btree *)&fStack_d10.trie;
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119bc8;
        sprintf((char *)handle_00.seqtree,"body%04d_update%d",paVar35,(ulong)uVar21);
        pfVar11 = pfStack_d58;
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119bd5;
        sVar5 = strlen((char *)__s);
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119bee;
        fVar2 = fdb_get_kv(pfVar11,__s,sVar5 + 1,&pfStack_d28,&sStack_d30);
        pfVar37 = pfStack_d28;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c6b;
          _snapshot_check();
LAB_00119c6b:
          uVar21 = (int)&fStack_d10 + 0x30;
          paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c7b;
          _snapshot_check();
          paStack_d88 = paVar16;
          goto LAB_00119c7b;
        }
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c07;
        iVar3 = bcmp(pfStack_d28,handle_00.seqtree,sStack_d30);
        pfVar11 = pfVar37;
        if (iVar3 != 0) goto LAB_00119c6b;
        paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c13;
        fdb_free_block(pfVar37);
        paVar35 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)(iVar4 + 1U);
        paVar13 = paVar16;
      } while (uStack_d64 != iVar4 + 1U);
    }
    paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c2e;
    fVar2 = fdb_kvs_close(pfStack_d58);
    aVar8 = aStack_d38;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c45;
      _snapshot_check();
      return;
    }
  }
LAB_00119c7b:
  paStack_d78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)rollback_to_zero_test;
  _snapshot_check();
  pcStack_12e0 = (code *)0x119ca2;
  pfStack_da0 = pfVar11;
  aStack_d98 = aVar8;
  aStack_d90 = handle_00;
  paStack_d80 = paVar35;
  paStack_d78 = __s;
  gettimeofday((timeval *)(acStack_1250 + 8),(__timezone_ptr_t)0x0);
  pcStack_12e0 = (code *)0x119ca7;
  memleak_start();
  pcStack_12e0 = (code *)0x119cb3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_12e0 = (code *)0x119cc3;
  fdb_get_default_config();
  pcStack_12e0 = (code *)0x119ccd;
  fdb_get_default_kvs_config();
  fStack_e98.buffercache_size = 0;
  fStack_e98.wal_threshold = 0x400;
  fStack_e98.flags = 1;
  fStack_e98.compaction_threshold = '\0';
  pcStack_12e0 = (code *)0x119d00;
  fStack_e98.multi_kv_instances = (bool)(char)uVar21;
  fdb_open(&pfStack_12c8,"./mvcc_test1",&fStack_e98);
  uStack_12bc = uVar21;
  if (uVar21 == 0) {
    pcStack_12e0 = (code *)0x119d6f;
    fdb_kvs_open_default(pfStack_12c8,apfStack_12b8,&fStack_1268);
    lVar9 = 1;
  }
  else {
    ppfVar15 = apfStack_12b8;
    aVar8.seqtree = (btree *)&fStack_1268;
    uVar25 = 0;
    do {
      pcStack_12e0 = (code *)0x119d34;
      sprintf(acStack_1250,"kv%d",uVar25 & 0xffffffff);
      pcStack_12e0 = (code *)0x119d47;
      fdb_kvs_open(pfStack_12c8,ppfVar15,acStack_1250,(fdb_kvs_config *)aVar8.seqtree);
      uVar25 = uVar25 + 1;
      ppfVar15 = ppfVar15 + 1;
    } while (uVar25 != 4);
    lVar9 = 4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  ppfVar15 = (fdb_kvs_handle **)0x0;
  pcVar12 = logCallbackFunc;
  pcVar33 = "rollback_to_zero_test";
  do {
    pfVar11 = apfStack_12b8[(long)ppfVar15];
    pcStack_12e0 = (code *)0x119d95;
    fVar2 = fdb_set_log_callback(pfVar11,logCallbackFunc,"rollback_to_zero_test");
    iVar4 = (int)pfVar11;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_12e0 = (code *)0x11a31e;
      rollback_to_zero_test();
      goto LAB_0011a31e;
    }
    ppfVar15 = (fdb_kvs_handle **)((long)ppfVar15 + 1);
  } while ((fdb_kvs_handle **)lVar9 != ppfVar15);
  uVar25 = 0;
  do {
    pcStack_12e0 = (code *)0x119dc4;
    sprintf(acStack_1098,"key%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x119de0;
    sprintf(acStack_1198,"meta%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x119dfc;
    sprintf(acStack_f98,"body%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x119e0f;
    sVar5 = strlen(acStack_1098);
    pcStack_12e0 = (code *)0x119e1a;
    sVar6 = strlen(acStack_1198);
    pcStack_12e0 = (code *)0x119e25;
    sVar7 = strlen(acStack_f98);
    pcStack_12e0 = (code *)0x119e4a;
    fdb_doc_create((fdb_doc **)&aaStack_1238[uVar25].seqtree,acStack_1098,sVar5,acStack_1198,sVar6,
                   acStack_f98,sVar7);
    lVar28 = 0;
    do {
      pcStack_12e0 = (code *)0x119e5a;
      fdb_set(apfStack_12b8[lVar28],(fdb_doc *)aaStack_1238[uVar25].seqtree);
      lVar28 = lVar28 + 1;
    } while (lVar9 != lVar28);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 5);
  pcStack_12e0 = (code *)0x119e7e;
  fdb_commit(pfStack_12c8,'\x01');
  uVar25 = 5;
  do {
    pcStack_12e0 = (code *)0x119ea0;
    sprintf(acStack_1098,"key%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x119ebc;
    sprintf(acStack_1198,"meta%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x119ed8;
    sprintf(acStack_f98,"body%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x119eeb;
    sVar5 = strlen(acStack_1098);
    pcStack_12e0 = (code *)0x119ef6;
    sVar6 = strlen(acStack_1198);
    pcStack_12e0 = (code *)0x119f01;
    sVar7 = strlen(acStack_f98);
    pcStack_12e0 = (code *)0x119f26;
    fdb_doc_create((fdb_doc **)&aaStack_1238[uVar25].seqtree,acStack_1098,sVar5,acStack_1198,sVar6,
                   acStack_f98,sVar7);
    lVar28 = 0;
    do {
      pcStack_12e0 = (code *)0x119f37;
      fdb_set(apfStack_12b8[lVar28],(fdb_doc *)aaStack_1238[uVar25].seqtree);
      lVar28 = lVar28 + 1;
    } while (lVar9 != lVar28);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 10);
  pcStack_12e0 = (code *)0x119f58;
  fdb_commit(pfStack_12c8,'\0');
  uVar25 = 10;
  do {
    pcStack_12e0 = (code *)0x119f7a;
    sprintf(acStack_1098,"key%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x119f96;
    sprintf(acStack_1198,"meta%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x119fb2;
    sprintf(acStack_f98,"body%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x119fc5;
    sVar5 = strlen(acStack_1098);
    pcStack_12e0 = (code *)0x119fd0;
    sVar6 = strlen(acStack_1198);
    pcStack_12e0 = (code *)0x119fdb;
    sVar7 = strlen(acStack_f98);
    pcStack_12e0 = (code *)0x11a000;
    fdb_doc_create((fdb_doc **)&aaStack_1238[uVar25].seqtree,acStack_1098,sVar5,acStack_1198,sVar6,
                   acStack_f98,sVar7);
    lVar28 = 0;
    do {
      pcStack_12e0 = (code *)0x11a011;
      fdb_set(apfStack_12b8[lVar28],(fdb_doc *)aaStack_1238[uVar25].seqtree);
      lVar28 = lVar28 + 1;
    } while (lVar9 != lVar28);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 0xf);
  pcStack_12e0 = (code *)0x11a035;
  fdb_commit(pfStack_12c8,'\x01');
  uVar25 = 0xf;
  do {
    pcStack_12e0 = (code *)0x11a057;
    sprintf(acStack_1098,"key%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x11a073;
    sprintf(acStack_1198,"meta%d",uVar25 & 0xffffffff);
    pcStack_12e0 = (code *)0x11a08f;
    sprintf(acStack_f98,"body%d",uVar25 & 0xffffffff);
    aVar8.seqtree = (btree *)(aaStack_1238 + uVar25);
    pcStack_12e0 = (code *)0x11a0a2;
    sVar5 = strlen(acStack_1098);
    pcStack_12e0 = (code *)0x11a0ad;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1198);
    pcStack_12e0 = (code *)0x11a0b8;
    sVar6 = strlen(acStack_f98);
    pcStack_12e0 = (code *)0x11a0dd;
    fdb_doc_create((fdb_doc **)aVar8.seqtree,acStack_1098,sVar5,acStack_1198,(size_t)handle_00,
                   acStack_f98,sVar6);
    ppfVar15 = (fdb_kvs_handle **)0x0;
    do {
      pcStack_12e0 = (code *)0x11a0ee;
      fdb_set(apfStack_12b8[(long)ppfVar15],
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(aVar8.seqtree)->ksize)->seqtree);
      ppfVar15 = (fdb_kvs_handle **)((long)ppfVar15 + 1);
    } while ((fdb_kvs_handle **)lVar9 != ppfVar15);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 0x14);
  pcStack_12e0 = (code *)0x11a10f;
  fdb_commit(pfStack_12c8,'\0');
  pcVar12 = (code *)(ulong)uStack_12bc;
  if ((char)uStack_12bc != '\0') {
    aVar8.seqtree = (btree *)&fStack_1298.doc_count;
    handle_00.seqtree = (btree *)&fStack_1298.space_used;
    pcVar12 = (code *)(apfStack_12b8 + 4);
    pcVar33 = (char *)apfStack_12b8;
    do {
      ppfVar15 = (fdb_kvs_handle **)pcVar33;
      pcStack_12e0 = (code *)0x11a13c;
      ppfVar32 = ppfVar15;
      fVar2 = fdb_rollback(ppfVar15,0);
      iVar4 = (int)ppfVar32;
      pcVar33 = (char *)ppfVar15;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a323;
      pfVar11 = *ppfVar15;
      pcStack_12e0 = (code *)0x11a152;
      fVar2 = fdb_get_kvs_info(pfVar11,(fdb_kvs_info *)pcVar12);
      iVar4 = (int)pfVar11;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a31e;
      if (fStack_1298.last_seqnum != 0) {
        pcStack_12e0 = (code *)0x11a1bb;
        rollback_to_zero_test();
      }
      if (fStack_1298.doc_count != 0) {
        pcStack_12e0 = (code *)0x11a1c5;
        rollback_to_zero_test();
      }
      if (fStack_1298.space_used != 0) {
        pcStack_12e0 = (code *)0x11a1cf;
        rollback_to_zero_test();
      }
      pfVar11 = *ppfVar15;
      pcStack_12e0 = (code *)0x11a182;
      fVar2 = fdb_get(pfVar11,(fdb_doc *)aaStack_1238[0].seqtree);
      iVar4 = (int)pfVar11;
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a32d;
      pfVar11 = *ppfVar15;
      pcStack_12e0 = (code *)0x11a19b;
      fVar2 = fdb_set(pfVar11,(fdb_doc *)aaStack_1238[0].seqtree);
      iVar4 = (int)pfVar11;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a328;
      pcVar33 = (char *)(ppfVar15 + 1);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
LAB_0011a267:
    pcStack_12e0 = (code *)0x11a276;
    pfVar22 = pfStack_12c8;
    fVar2 = fdb_commit(pfStack_12c8,'\x01');
    iVar4 = (int)pfVar22;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_12e0 = (code *)0x11a288;
      fdb_close(pfStack_12c8);
      lVar9 = 0;
      do {
        pcStack_12e0 = (code *)0x11a297;
        fdb_doc_free((fdb_doc *)aaStack_1238[lVar9].seqtree);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x14);
      pcStack_12e0 = (code *)0x11a2a5;
      fdb_shutdown();
      pcStack_12e0 = (code *)0x11a2aa;
      memleak_end();
      pcVar33 = "single kv mode:";
      if ((char)uStack_12bc != '\0') {
        pcVar33 = "multiple kv mode:";
      }
      pcStack_12e0 = (code *)0x11a2da;
      sprintf(acStack_f98,"rollback to zero test %s",pcVar33);
      pcVar33 = "%s PASSED\n";
      if (rollback_to_zero_test(bool)::__test_pass != '\0') {
        pcVar33 = "%s FAILED\n";
      }
      pcStack_12e0 = (code *)0x11a307;
      fprintf(_stderr,pcVar33,acStack_f98);
      return;
    }
    goto LAB_0011a332;
  }
  ppfVar32 = apfStack_12b8;
  pcStack_12e0 = (code *)0x11a1dd;
  fVar2 = fdb_rollback(ppfVar32,0);
  iVar4 = (int)ppfVar32;
  pcVar33 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a337;
  pcStack_12e0 = (code *)0x11a1f4;
  pfVar11 = apfStack_12b8[0];
  fVar2 = fdb_get_kvs_info(apfStack_12b8[0],(fdb_kvs_info *)(apfStack_12b8 + 4));
  iVar4 = (int)pfVar11;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a33c;
  if (fStack_1298.last_seqnum != 0) {
    pcStack_12e0 = (code *)0x11a20e;
    rollback_to_zero_test();
  }
  if (fStack_1298.doc_count != 0) {
    pcStack_12e0 = (code *)0x11a220;
    rollback_to_zero_test();
  }
  if (fStack_1298.space_used != 0) {
    pcStack_12e0 = (code *)0x11a232;
    rollback_to_zero_test();
  }
  pcStack_12e0 = (code *)0x11a244;
  pfVar11 = apfStack_12b8[0];
  fVar2 = fdb_get(apfStack_12b8[0],(fdb_doc *)aaStack_1238[0].seqtree);
  iVar4 = (int)pfVar11;
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a341;
  pcStack_12e0 = (code *)0x11a25f;
  fVar2 = fdb_set(apfStack_12b8[0],(fdb_doc *)aaStack_1238[0].seqtree);
  iVar4 = (int)apfStack_12b8[0];
  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011a267;
  goto LAB_0011a346;
LAB_0011a977:
  pcStack_1608 = (code *)0x11a97c;
  rollback_to_zero_after_compact_test();
LAB_0011a97c:
  pcStack_1608 = (code *)0x11a981;
  rollback_to_zero_after_compact_test();
LAB_0011a981:
  pcStack_1608 = (code *)0x11a986;
  rollback_to_zero_after_compact_test();
LAB_0011a986:
  pcStack_1608 = (code *)0x11a98b;
  rollback_to_zero_after_compact_test();
  goto LAB_0011a98b;
LAB_0011b672:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b677;
  rollback_all_test();
LAB_0011b677:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b67c;
  rollback_all_test();
LAB_0011b67c:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b684;
  rollback_all_test();
  aVar20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar12;
LAB_0011b684:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b689;
  rollback_all_test();
LAB_0011b689:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b68e;
  rollback_all_test();
LAB_0011b68e:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b693;
  rollback_all_test();
LAB_0011b693:
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b698;
  rollback_all_test();
  goto LAB_0011b698;
LAB_0011be65:
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be6a;
  rollback_during_ops_test();
LAB_0011be6a:
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be6f;
  rollback_during_ops_test();
  goto LAB_0011be6f;
LAB_0011c266:
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c26b;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c26b;
LAB_0011c67b:
  pcStack_54b0 = (code *)0x11c680;
  rollback_drop_multi_files_kvs_test();
LAB_0011c680:
  pcStack_54b0 = (code *)0x11c685;
  rollback_drop_multi_files_kvs_test();
LAB_0011c685:
  pcStack_54b0 = (code *)0x11c68a;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68a:
  pcStack_54b0 = (code *)0x11c68f;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68f:
  pcStack_54b0 = (code *)0x11c694;
  rollback_drop_multi_files_kvs_test();
LAB_0011c694:
  pcStack_54b0 = (code *)0x11c699;
  rollback_drop_multi_files_kvs_test();
LAB_0011c699:
  pcStack_54b0 = (code *)0x11c69e;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c69e;
LAB_0011cbcd:
  pcStack_59b8 = (code *)0x11cbd2;
  rollback_without_seqtree();
  goto LAB_0011cbd2;
LAB_0011cf63:
  pfStack_5b90 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_5b90 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
LAB_0011a31e:
  pcStack_12e0 = (code *)0x11a323;
  rollback_to_zero_test();
LAB_0011a323:
  pcStack_12e0 = (code *)0x11a328;
  rollback_to_zero_test();
LAB_0011a328:
  pcStack_12e0 = (code *)0x11a32d;
  rollback_to_zero_test();
LAB_0011a32d:
  pcStack_12e0 = (code *)0x11a332;
  rollback_to_zero_test();
LAB_0011a332:
  pcStack_12e0 = (code *)0x11a337;
  rollback_to_zero_test();
LAB_0011a337:
  pcStack_12e0 = (code *)0x11a33c;
  rollback_to_zero_test();
LAB_0011a33c:
  pcStack_12e0 = (code *)0x11a341;
  rollback_to_zero_test();
LAB_0011a341:
  pcStack_12e0 = (code *)0x11a346;
  rollback_to_zero_test();
LAB_0011a346:
  pcStack_12e0 = rollback_to_zero_after_compact_test;
  rollback_to_zero_test();
  pcStack_1608 = (code *)0x11a36d;
  pfStack_1308 = (fdb_kvs_info *)pcVar12;
  aStack_1300 = aVar8;
  aStack_12f8 = handle_00;
  ppfStack_12f0 = ppfVar15;
  ppfStack_12e8 = (fdb_kvs_handle **)pcVar33;
  pcStack_12e0 = (code *)lVar9;
  gettimeofday(&tStack_14b0,(__timezone_ptr_t)0x0);
  pcStack_1608 = (code *)0x11a379;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_1608 = (code *)0x11a389;
  fdb_get_default_config();
  pcStack_1608 = (code *)0x11a396;
  fdb_get_default_kvs_config();
  fStack_1400.buffercache_size = 0;
  fStack_1400.wal_threshold = 0x400;
  fStack_1400.flags = 1;
  fStack_1400.compaction_threshold = '\0';
  pcStack_1608 = (code *)0x11a3c9;
  fStack_1400.multi_kv_instances = (bool)(char)iVar4;
  fdb_open((fdb_file_handle **)&pfStack_15f8,"./mvcc_test1",&fStack_1400);
  iStack_15ec = iVar4;
  if (iVar4 == 0) {
    pcStack_1608 = (code *)0x11a43e;
    fdb_kvs_open_default
              ((fdb_file_handle *)pfStack_15f8,(fdb_kvs_handle **)auStack_15e0,
               (fdb_kvs_config *)(auStack_15e0 + 0xd0));
    pcVar33 = (char *)0x1;
  }
  else {
    ppfVar15 = (fdb_kvs_handle **)auStack_15e0;
    aVar8.seqtree = (btree *)(auStack_15e0 + 0xd0);
    uVar25 = 0;
    do {
      pcStack_1608 = (code *)0x11a400;
      sprintf(acStack_14f8,"kv%d",uVar25 & 0xffffffff);
      pcStack_1608 = (code *)0x11a413;
      fdb_kvs_open((fdb_file_handle *)pfStack_15f8,ppfVar15,acStack_14f8,
                   (fdb_kvs_config *)aVar8.seqtree);
      uVar25 = uVar25 + 1;
      ppfVar15 = ppfVar15 + 1;
    } while (uVar25 != 4);
    pcVar33 = (char *)0x4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar30 = (char *)0x0;
  pcVar12 = logCallbackFunc;
  pcVar29 = "rollback_to_zero_after_compact_test";
  do {
    pfVar11 = *(fdb_kvs_handle **)(auStack_15e0 + (long)pcVar30 * 8);
    pcStack_1608 = (code *)0x11a464;
    fVar2 = fdb_set_log_callback(pfVar11,logCallbackFunc,"rollback_to_zero_after_compact_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1608 = (code *)0x11a977;
      rollback_to_zero_after_compact_test();
      goto LAB_0011a977;
    }
    pcVar30 = pcVar30 + 1;
  } while (pcVar33 != pcVar30);
  uVar25 = 0;
  do {
    pcStack_1608 = (code *)0x11a493;
    sprintf(auStack_15e0 + 0x90,"key%d",uVar25 & 0xffffffff);
    pcStack_1608 = (code *)0x11a4a9;
    sprintf(auStack_15e0 + 0x50,"meta%d",uVar25 & 0xffffffff);
    pcStack_1608 = (code *)0x11a4c2;
    sprintf(acStack_14f0,"body%d",uVar25 & 0xffffffff);
    pcStack_1608 = (code *)0x11a4d5;
    sVar5 = strlen(auStack_15e0 + 0x90);
    pcStack_1608 = (code *)0x11a4e5;
    sVar6 = strlen(auStack_15e0 + 0x50);
    pcStack_1608 = (code *)0x11a4f5;
    sVar7 = strlen(acStack_14f0);
    pcStack_1608 = (code *)0x11a51a;
    fdb_doc_create((fdb_doc **)&aaStack_14a0[uVar25].seqtree,auStack_15e0 + 0x90,sVar5,
                   auStack_15e0 + 0x50,sVar6,acStack_14f0,sVar7);
    lVar9 = 0;
    do {
      pcStack_1608 = (code *)0x11a52b;
      fdb_set(*(fdb_kvs_handle **)(auStack_15e0 + lVar9 * 8),(fdb_doc *)aaStack_14a0[uVar25].seqtree
             );
      lVar9 = lVar9 + 1;
    } while (pcVar33 != (char *)lVar9);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 5);
  pcStack_1608 = (code *)0x11a54f;
  fdb_commit((fdb_file_handle *)pfStack_15f8,'\x01');
  uVar25 = 5;
  do {
    pcStack_1608 = (code *)0x11a571;
    sprintf(auStack_15e0 + 0x90,"key%d",uVar25 & 0xffffffff);
    pcStack_1608 = (code *)0x11a58a;
    sprintf(auStack_15e0 + 0x50,"meta%d",uVar25 & 0xffffffff);
    pcStack_1608 = (code *)0x11a5a6;
    sprintf(acStack_14f0,"body%d",uVar25 & 0xffffffff);
    pcStack_1608 = (code *)0x11a5b9;
    sVar5 = strlen(auStack_15e0 + 0x90);
    pcStack_1608 = (code *)0x11a5c4;
    sVar6 = strlen(auStack_15e0 + 0x50);
    pcStack_1608 = (code *)0x11a5cf;
    sVar7 = strlen(acStack_14f0);
    pcStack_1608 = (code *)0x11a5f1;
    fdb_doc_create((fdb_doc **)&aaStack_14a0[uVar25].seqtree,auStack_15e0 + 0x90,sVar5,
                   auStack_15e0 + 0x50,sVar6,acStack_14f0,sVar7);
    lVar9 = 0;
    do {
      pcStack_1608 = (code *)0x11a601;
      fdb_set(*(fdb_kvs_handle **)(auStack_15e0 + lVar9 * 8),(fdb_doc *)aaStack_14a0[uVar25].seqtree
             );
      lVar9 = lVar9 + 1;
    } while (pcVar33 != (char *)lVar9);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 10);
  pcStack_1608 = (code *)0x11a622;
  fdb_commit((fdb_file_handle *)pfStack_15f8,'\0');
  uVar25 = 10;
  do {
    pcStack_1608 = (code *)0x11a644;
    sprintf(auStack_15e0 + 0x90,"key%d",uVar25 & 0xffffffff);
    pcStack_1608 = (code *)0x11a65d;
    sprintf(auStack_15e0 + 0x50,"meta%d",uVar25 & 0xffffffff);
    pcStack_1608 = (code *)0x11a679;
    sprintf(acStack_14f0,"body%d",uVar25 & 0xffffffff);
    pcStack_1608 = (code *)0x11a68c;
    sVar5 = strlen(auStack_15e0 + 0x90);
    pcStack_1608 = (code *)0x11a697;
    sVar6 = strlen(auStack_15e0 + 0x50);
    pcStack_1608 = (code *)0x11a6a2;
    sVar7 = strlen(acStack_14f0);
    pcStack_1608 = (code *)0x11a6c4;
    fdb_doc_create((fdb_doc **)&aaStack_14a0[uVar25].seqtree,auStack_15e0 + 0x90,sVar5,
                   auStack_15e0 + 0x50,sVar6,acStack_14f0,sVar7);
    lVar9 = 0;
    do {
      pcStack_1608 = (code *)0x11a6d4;
      fdb_set(*(fdb_kvs_handle **)(auStack_15e0 + lVar9 * 8),(fdb_doc *)aaStack_14a0[uVar25].seqtree
             );
      lVar9 = lVar9 + 1;
    } while (pcVar33 != (char *)lVar9);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 0xf);
  pcStack_1608 = (code *)0x11a6f8;
  fdb_commit((fdb_file_handle *)pfStack_15f8,'\x01');
  uVar25 = 0xf;
  do {
    pcStack_1608 = (code *)0x11a71a;
    sprintf(auStack_15e0 + 0x90,"key%d",uVar25 & 0xffffffff);
    pcStack_1608 = (code *)0x11a733;
    sprintf(auStack_15e0 + 0x50,"meta%d",uVar25 & 0xffffffff);
    pcVar30 = acStack_14f0;
    pcStack_1608 = (code *)0x11a74f;
    sprintf(pcVar30,"body%d",uVar25 & 0xffffffff);
    handle_00.seqtree = (btree *)(aaStack_14a0 + uVar25);
    pcStack_1608 = (code *)0x11a762;
    sVar5 = strlen(auStack_15e0 + 0x90);
    pcStack_1608 = (code *)0x11a76d;
    aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(auStack_15e0 + 0x50);
    pcStack_1608 = (code *)0x11a778;
    sVar6 = strlen(pcVar30);
    pcStack_1608 = (code *)0x11a79a;
    fdb_doc_create((fdb_doc **)handle_00.seqtree,auStack_15e0 + 0x90,sVar5,auStack_15e0 + 0x50,
                   (size_t)aVar8,pcVar30,sVar6);
    pcVar12 = (code *)0x0;
    do {
      pcStack_1608 = (code *)0x11a7aa;
      fdb_set(*(fdb_kvs_handle **)(auStack_15e0 + (long)pcVar12 * 8),
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(handle_00.seqtree)->ksize)->
              seqtree);
      pcVar12 = (code *)((long)pcVar12 + 1);
    } while ((code *)pcVar33 != pcVar12);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 0x14);
  pcStack_1608 = (code *)0x11a7cb;
  fdb_commit((fdb_file_handle *)pfStack_15f8,'\0');
  pfVar11 = (fdb_kvs_handle *)&pfStack_15e8;
  pcStack_1608 = (code *)0x11a7e4;
  fVar2 = fdb_open((fdb_file_handle **)pfVar11,"./mvcc_test1",&fStack_1400);
  pcVar29 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_1608 = (code *)0x11a7fd;
    pfVar11 = pfStack_15e8;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_15e8,"./mvcc_test2");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a990;
    pcStack_1608 = (code *)0x11a80f;
    fdb_close((fdb_file_handle *)pfStack_15e8);
    pcVar30 = auStack_15e0 + 0x30;
    aVar8.seqtree = (btree *)(auStack_15e0 + 0x40);
    pcVar33 = (char *)(ulong)(uint)((int)pcVar33 << 3);
    pcVar29 = (char *)0x0;
    handle_00.seqtree = (btree *)(auStack_15e0 + 0x20);
    do {
      pcVar12 = (code *)(auStack_15e0 + (long)pcVar29);
      pcStack_1608 = (code *)0x11a836;
      pfVar11 = (fdb_kvs_handle *)pcVar12;
      fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar12,0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a97c;
      pfVar11 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar12)->kvs_config;
      pcStack_1608 = (code *)0x11a849;
      fVar2 = fdb_get_kvs_info(pfVar11,(fdb_kvs_info *)handle_00.seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a977;
      if ((hbtrie *)auStack_15e0._40_8_ != (hbtrie *)0x0) {
        pcStack_1608 = (code *)0x11a8af;
        rollback_to_zero_after_compact_test();
      }
      if ((btree *)auStack_15e0._48_8_ != (btree *)0x0) {
        pcStack_1608 = (code *)0x11a8b9;
        rollback_to_zero_after_compact_test();
      }
      if ((filemgr *)auStack_15e0._64_8_ != (filemgr *)0x0) {
        pcStack_1608 = (code *)0x11a8c3;
        rollback_to_zero_after_compact_test();
      }
      pfVar11 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar12)->kvs_config;
      pcStack_1608 = (code *)0x11a879;
      fVar2 = fdb_get(pfVar11,(fdb_doc *)aaStack_14a0[0].seqtree);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a986;
      pfVar11 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar12)->kvs_config;
      pcStack_1608 = (code *)0x11a892;
      fVar2 = fdb_set(pfVar11,(fdb_doc *)aaStack_14a0[0].seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a981;
      pcVar29 = pcVar29 + 8;
    } while (pcVar33 != pcVar29);
    pcStack_1608 = (code *)0x11a8d4;
    pfVar11 = pfStack_15f8;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_15f8,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1608 = (code *)0x11a8e6;
      fdb_close((fdb_file_handle *)pfStack_15f8);
      lVar9 = 0;
      do {
        pcStack_1608 = (code *)0x11a8f5;
        fdb_doc_free((fdb_doc *)aaStack_14a0[lVar9].seqtree);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x14);
      pcStack_1608 = (code *)0x11a903;
      fdb_shutdown();
      pcVar33 = "single kv mode:";
      if ((char)iStack_15ec != '\0') {
        pcVar33 = "multiple kv mode:";
      }
      pcStack_1608 = (code *)0x11a933;
      sprintf(acStack_14f0,"rollback to zero after compact test %s",pcVar33);
      pcVar33 = "%s PASSED\n";
      if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
        pcVar33 = "%s FAILED\n";
      }
      pcStack_1608 = (code *)0x11a960;
      fprintf(_stderr,pcVar33,acStack_14f0);
      return;
    }
  }
  else {
LAB_0011a98b:
    pcStack_1608 = (code *)0x11a990;
    rollback_to_zero_after_compact_test();
LAB_0011a990:
    pcStack_1608 = (code *)0x11a995;
    rollback_to_zero_after_compact_test();
  }
  pcStack_1608 = rollback_to_wal_test;
  rollback_to_zero_after_compact_test();
  __s_00 = (char *)((ulong)pfVar11 & 0xffffffff);
  pcStack_2410 = (code *)0x11a9b9;
  pfStack_1630 = (fdb_kvs_handle *)pcVar12;
  aStack_1628 = aVar8;
  aStack_1620 = handle_00;
  pcStack_1618 = pcVar29;
  pcStack_1610 = pcVar30;
  pcStack_1608 = (code *)pcVar33;
  gettimeofday(&tStack_23c0,(__timezone_ptr_t)0x0);
  pcStack_2410 = (code *)0x11a9be;
  memleak_start();
  pcStack_2410 = (code *)0x11a9ca;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_2410 = (code *)0x11a9da;
  fdb_get_default_config();
  config = &fStack_23b0;
  pcStack_2410 = (code *)0x11a9e7;
  fdb_get_default_kvs_config();
  fStack_2090.buffercache_size = 0;
  fStack_2090.wal_threshold = 0x100;
  fStack_2090.flags = 1;
  fStack_2090.compaction_threshold = '\0';
  uStack_23d4 = SUB84(pfVar11,0);
  fStack_2090.multi_kv_instances = SUB81(__s_00,0);
  doc_02 = (fdb_doc *)(auStack_23f8 + 0x18);
  pcStack_2410 = (code *)0x11aa21;
  fdb_open((fdb_file_handle **)doc_02,"./mvcc_test8",&fStack_2090);
  ptr_handle = (fdb_doc *)auStack_23f8;
  pcStack_2410 = (code *)0x11aa34;
  fdb_kvs_open_default((fdb_file_handle *)auStack_23f8._24_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_2410 = (code *)0x11aa4a;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_23f8._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar9 = 0;
    uVar25 = 0;
    do {
      pcStack_2410 = (code *)0x11aa74;
      sprintf(acStack_2298,"key%d",uVar25 & 0xffffffff);
      pcStack_2410 = (code *)0x11aa8d;
      sprintf(acStack_2198,"meta%d",uVar25 & 0xffffffff);
      pcStack_2410 = (code *)0x11aaa3;
      sprintf((char *)afStack_2398,"body%d",uVar25 & 0xffffffff);
      pcStack_2410 = (code *)0x11aab6;
      sVar5 = strlen(acStack_2298);
      pcStack_2410 = (code *)0x11aac9;
      sVar6 = strlen(acStack_2198);
      pcStack_2410 = (code *)0x11aad6;
      sVar7 = strlen((char *)afStack_2398);
      pcStack_2410 = (code *)0x11aaf8;
      fdb_doc_create((fdb_doc **)((long)&pfStack_1f98 + lVar9),acStack_2298,sVar5,acStack_2198,sVar6
                     ,afStack_2398,sVar7);
      pcStack_2410 = (code *)0x11ab0a;
      fdb_set((fdb_kvs_handle *)auStack_23f8._0_8_,(&pfStack_1f98)[uVar25]);
      uVar25 = uVar25 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar25 != 300);
    pcStack_2410 = (code *)0x11ab2a;
    fdb_commit((fdb_file_handle *)auStack_23f8._24_8_,'\0');
    lVar9 = 0;
    uVar25 = 0;
    do {
      ppfStack_23c8 = (fdb_doc **)((long)&pfStack_1f98 + lVar9);
      pcStack_2410 = (code *)0x11ab4c;
      fdb_doc_free((&pfStack_1f98)[uVar25]);
      pcStack_2410 = (code *)0x11ab68;
      sprintf(acStack_2298,"key%d",uVar25 & 0xffffffff);
      pcStack_2410 = (code *)0x11ab84;
      sprintf(acStack_2198,"META%d",uVar25 & 0xffffffff);
      pcStack_2410 = (code *)0x11ab9d;
      sprintf((char *)afStack_2398,"BODY%d",uVar25 & 0xffffffff);
      pcStack_2410 = (code *)0x11aba5;
      sVar5 = strlen(acStack_2298);
      pcStack_2410 = (code *)0x11abb0;
      sVar6 = strlen(acStack_2198);
      pcStack_2410 = (code *)0x11abbb;
      sVar7 = strlen((char *)afStack_2398);
      pcStack_2410 = (code *)0x11abdd;
      fdb_doc_create(ppfStack_23c8,acStack_2298,sVar5,acStack_2198,sVar6,afStack_2398,sVar7);
      pcStack_2410 = (code *)0x11abef;
      fdb_set((fdb_kvs_handle *)auStack_23f8._0_8_,(&pfStack_1f98)[uVar25]);
      uVar25 = uVar25 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar25 != 0x96);
    pcStack_2410 = (code *)0x11ac0f;
    fdb_commit((fdb_file_handle *)auStack_23f8._24_8_,'\0');
    uVar25 = 0x96;
    doc_02 = afStack_1ae8;
    do {
      pcStack_2410 = (code *)0x11ac25;
      fdb_doc_free((fdb_doc *)doc_02->keylen);
      pcStack_2410 = (code *)0x11ac41;
      sprintf(acStack_2298,"key%d",uVar25 & 0xffffffff);
      __s_00 = acStack_2198;
      pcStack_2410 = (code *)0x11ac5d;
      sprintf(__s_00,"Meta%d",uVar25 & 0xffffffff);
      ptr_handle = afStack_2398;
      pcStack_2410 = (code *)0x11ac76;
      sprintf((char *)ptr_handle,"Body%d",uVar25 & 0xffffffff);
      pcStack_2410 = (code *)0x11ac7e;
      aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_2298);
      pcStack_2410 = (code *)0x11ac89;
      handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(__s_00);
      pcStack_2410 = (code *)0x11ac94;
      sVar5 = strlen((char *)ptr_handle);
      pcStack_2410 = (code *)0x11acb4;
      fdb_doc_create((fdb_doc **)doc_02,acStack_2298,(size_t)aVar8,__s_00,(size_t)handle_00,
                     ptr_handle,sVar5);
      pcStack_2410 = (code *)0x11acc1;
      fdb_set((fdb_kvs_handle *)auStack_23f8._0_8_,(fdb_doc *)doc_02->keylen);
      uVar25 = uVar25 + 1;
      doc_02 = (fdb_doc *)&doc_02->metalen;
    } while (uVar25 != 300);
    pcStack_2410 = (code *)0x11ace1;
    fdb_commit((fdb_file_handle *)auStack_23f8._24_8_,'\0');
    pcStack_2410 = (code *)0x11acf0;
    fVar2 = fdb_rollback((fdb_kvs_handle **)auStack_23f8,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae48;
    pcStack_2410 = (code *)0x11ad21;
    fdb_doc_create((fdb_doc **)(auStack_23f8 + 0x10),(void *)psStack_1f90[4],*psStack_1f90,
                   (void *)0x0,0,(void *)0x0,0);
    pcStack_2410 = (code *)0x11ad35;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_23f8._0_8_,&pfStack_23d0,0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae4d;
    pcStack_2410 = (code *)0x11ad4c;
    fVar2 = fdb_get(pfStack_23d0,(fdb_doc *)auStack_23f8._16_8_);
    pfVar36 = (fdb_doc *)auStack_23f8._16_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae52;
    ptr_handle = *(fdb_doc **)(auStack_23f8._16_8_ + 0x40);
    config = (fdb_kvs_config *)psStack_1f90[8];
    pcStack_2410 = (code *)0x11ad78;
    iVar4 = bcmp(ptr_handle,config,*(size_t *)(auStack_23f8._16_8_ + 0x10));
    if (iVar4 == 0) {
      if (*(uint64_t *)((long)pfVar36 + 0x28) != 0x12e) {
        pcStack_2410 = (code *)0x11ad94;
        rollback_to_wal_test();
      }
      pcStack_2410 = (code *)0x11ad9e;
      fdb_doc_free((fdb_doc *)auStack_23f8._16_8_);
      pcStack_2410 = (code *)0x11ada8;
      fdb_kvs_close(pfStack_23d0);
      pcStack_2410 = (code *)0x11adb2;
      fdb_close((fdb_file_handle *)auStack_23f8._24_8_);
      lVar9 = 0;
      do {
        pcStack_2410 = (code *)0x11adc1;
        fdb_doc_free((&pfStack_1f98)[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 300);
      pcStack_2410 = (code *)0x11add2;
      fdb_shutdown();
      pcStack_2410 = (code *)0x11add7;
      memleak_end();
      pcVar33 = "single kv mode:";
      if ((char)uStack_23d4 != '\0') {
        pcVar33 = "multiple kv mode:";
      }
      pcStack_2410 = (code *)0x11ae04;
      sprintf((char *)afStack_2398,"rollback to wal test %s",pcVar33);
      pcVar33 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar33 = "%s FAILED\n";
      }
      pcStack_2410 = (code *)0x11ae31;
      fprintf(_stderr,pcVar33,afStack_2398);
      return;
    }
  }
  else {
    pcStack_2410 = (code *)0x11ae48;
    rollback_to_wal_test();
LAB_0011ae48:
    pcStack_2410 = (code *)0x11ae4d;
    rollback_to_wal_test();
LAB_0011ae4d:
    pcStack_2410 = (code *)0x11ae52;
    rollback_to_wal_test();
LAB_0011ae52:
    pfVar36 = doc_02;
    pcStack_2410 = (code *)0x11ae57;
    rollback_to_wal_test();
  }
  pcStack_2410 = rollback_all_test;
  pfVar23 = config;
  rollback_to_wal_test();
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae87;
  pfStack_2438 = ptr_handle;
  aStack_2430 = aVar8;
  aStack_2428 = handle_00;
  pfStack_2420 = config;
  pfStack_2418 = pfVar36;
  pcStack_2410 = (code *)__s_00;
  gettimeofday(&tStack_28e0,(__timezone_ptr_t)0x0);
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae8c;
  memleak_start();
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aea8;
  fdb_get_default_config();
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aeb2;
  fdb_get_default_kvs_config();
  fStack_2530.buffercache_size._0_1_ = '\0';
  fStack_2530.buffercache_size._1_1_ = '\0';
  fStack_2530.buffercache_size._2_1_ = '\0';
  fStack_2530.buffercache_size._3_1_ = '\0';
  fStack_2530.buffercache_size._4_1_ = '\0';
  fStack_2530.buffercache_size._5_1_ = '\0';
  fStack_2530.buffercache_size._6_1_ = '\0';
  fStack_2530.buffercache_size._7_1_ = '\0';
  fStack_2530.wal_threshold._0_1_ = '\0';
  fStack_2530.wal_threshold._1_1_ = '\x04';
  fStack_2530.wal_threshold._2_1_ = '\0';
  fStack_2530.wal_threshold._3_1_ = '\0';
  fStack_2530.wal_threshold._4_1_ = '\0';
  fStack_2530.wal_threshold._5_1_ = '\0';
  fStack_2530.wal_threshold._6_1_ = '\0';
  fStack_2530.wal_threshold._7_1_ = '\0';
  fStack_2530.flags = 1;
  fStack_2530.compaction_threshold = 0;
  fStack_2530.block_reusing_threshold = 0;
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aee8;
  fStack_2530.multi_kv_instances = (bool)(char)pfVar23;
  fdb_open(&pfStack_2988,"./mvcc_test6",(fdb_config *)(acStack_2630 + 0x100));
  uStack_297c = (uint)pfVar23;
  if (uStack_297c == 0) {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af54;
    fdb_kvs_open_default
              (pfStack_2988,(fdb_kvs_handle **)&aaStack_2960[0].seqtree,
               (fdb_kvs_config *)(acStack_2930 + 8));
    aVar17 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
  }
  else {
    paVar13 = aaStack_2960;
    aVar8.seqtree = (btree *)(acStack_2930 + 8);
    uVar25 = 0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af19;
      sprintf(acStack_2930,"kv%d",uVar25 & 0xffffffff);
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af2c;
      fdb_kvs_open(pfStack_2988,(fdb_kvs_handle **)&paVar13->seqtree,acStack_2930,
                   (fdb_kvs_config *)aVar8.seqtree);
      uVar25 = uVar25 + 1;
      paVar13 = paVar13 + 1;
    } while (uVar25 != 4);
    aVar17 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar30 = (char *)0x0;
  pcVar12 = logCallbackFunc;
  pcVar33 = "rollback_all_test";
  do {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af7a;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)aaStack_2960[(long)pcVar30].seqtree,logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b672;
      rollback_all_test();
      goto LAB_0011b672;
    }
    pcVar30 = (char *)((hbtrie_func_readkey *)pcVar30 + 1);
  } while (aVar17.seqtree != (btree *)pcVar30);
  uVar25 = 0;
  do {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afa9;
    sprintf(acStack_2730,"key%d",uVar25 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afc5;
    sprintf(acStack_2830,"meta%d",uVar25 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe1;
    sprintf(acStack_2630,"body%d",uVar25 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aff4;
    sVar5 = strlen(acStack_2730);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afff;
    sVar6 = strlen(acStack_2830);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b00a;
    sVar7 = strlen(acStack_2630);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b02f;
    fdb_doc_create((fdb_doc **)&aaStack_28d0[uVar25].seqtree,acStack_2730,sVar5,acStack_2830,sVar6,
                   acStack_2630,sVar7);
    lVar9 = 0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b03f;
      fdb_set((fdb_kvs_handle *)aaStack_2960[lVar9].seqtree,(fdb_doc *)aaStack_28d0[uVar25].seqtree)
      ;
      lVar9 = lVar9 + 1;
    } while (aVar17.seqtree != (btree *)lVar9);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 5);
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b063;
  fdb_commit(pfStack_2988,'\x01');
  uVar25 = 5;
  do {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b085;
    sprintf(acStack_2730,"key%d",uVar25 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0a1;
    sprintf(acStack_2830,"meta%d",uVar25 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0bd;
    sprintf(acStack_2630,"body%d",uVar25 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0d0;
    sVar5 = strlen(acStack_2730);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0db;
    sVar6 = strlen(acStack_2830);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0e6;
    sVar7 = strlen(acStack_2630);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b10b;
    fdb_doc_create((fdb_doc **)&aaStack_28d0[uVar25].seqtree,acStack_2730,sVar5,acStack_2830,sVar6,
                   acStack_2630,sVar7);
    lVar9 = 0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b11c;
      fdb_set((fdb_kvs_handle *)aaStack_2960[lVar9].seqtree,(fdb_doc *)aaStack_28d0[uVar25].seqtree)
      ;
      lVar9 = lVar9 + 1;
    } while (aVar17.seqtree != (btree *)lVar9);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 10);
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b13d;
  fdb_commit(pfStack_2988,'\0');
  uVar25 = 10;
  do {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b15f;
    sprintf(acStack_2730,"key%d",uVar25 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b17b;
    sprintf(acStack_2830,"meta%d",uVar25 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b197;
    sprintf(acStack_2630,"body%d",uVar25 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1aa;
    sVar5 = strlen(acStack_2730);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1b5;
    sVar6 = strlen(acStack_2830);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1c0;
    sVar7 = strlen(acStack_2630);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1e5;
    fdb_doc_create((fdb_doc **)&aaStack_28d0[uVar25].seqtree,acStack_2730,sVar5,acStack_2830,sVar6,
                   acStack_2630,sVar7);
    lVar9 = 0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1f6;
      fdb_set((fdb_kvs_handle *)aaStack_2960[lVar9].seqtree,(fdb_doc *)aaStack_28d0[uVar25].seqtree)
      ;
      lVar9 = lVar9 + 1;
    } while (aVar17.seqtree != (btree *)lVar9);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 0xf);
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b21a;
  fdb_commit(pfStack_2988,'\x01');
  uVar25 = 0xf;
  do {
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b23c;
    sprintf(acStack_2730,"key%d",uVar25 & 0xffffffff);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b258;
    sprintf(acStack_2830,"meta%d",uVar25 & 0xffffffff);
    aVar20.seqtree = (btree *)acStack_2630;
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b274;
    sprintf((char *)aVar20.seqtree,"body%d",uVar25 & 0xffffffff);
    aVar8.seqtree = (btree *)(aaStack_28d0 + uVar25);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b287;
    sVar5 = strlen(acStack_2730);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b292;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_2830);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b29d;
    sVar6 = strlen((char *)aVar20.seqtree);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2c2;
    fdb_doc_create((fdb_doc **)aVar8.seqtree,acStack_2730,sVar5,acStack_2830,(size_t)handle_00,
                   aVar20.seqtree,sVar6);
    pcVar30 = (char *)0x0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2d3;
      fdb_set((fdb_kvs_handle *)aaStack_2960[(long)pcVar30].seqtree,
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(aVar8.seqtree)->ksize)->seqtree);
      pcVar30 = (char *)((long)pcVar30 + 1);
    } while (aVar17.seqtree != (btree *)pcVar30);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 0x14);
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2f4;
  fdb_commit(pfStack_2988,'\0');
  aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b308;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_2988,(fdb_snapshot_info_t **)&pfStack_2970,(uint64_t *)&pfStack_2978);
  pcVar33 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar30 = (char *)(ulong)uStack_297c;
    cVar26 = (char)uStack_297c;
    if (cVar26 == '\0') {
      if (pfStack_2978 != (fdb_kvs_handle *)0x4) {
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b341;
        rollback_all_test();
      }
    }
    else if (pfStack_2978 != (fdb_kvs_handle *)0x8) {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b32f;
      rollback_all_test();
    }
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b354;
    fVar2 = fdb_rollback_all(pfStack_2988,(fdb_snapshot_marker_t)pfStack_2970->kvs);
    if (cVar26 == '\0') {
LAB_0011b41a:
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b69d;
      handle_00.seqtree = (btree *)&aStack_2968;
      if (cVar26 != '\0') {
        pcVar33 = acStack_2930;
        pcVar30 = "rollback_all_test";
        aVar20.seqtree = (btree *)0x0;
        aVar8 = aVar17;
        do {
          handle_00.seqtree = handle_00.seqtree + 8;
          aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b450;
          sprintf(pcVar33,"kv%d",aVar20.seqtree);
          aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b465;
          fVar2 = fdb_kvs_open(pfStack_2988,(fdb_kvs_handle **)handle_00.seqtree,pcVar33,
                               (fdb_kvs_config *)(acStack_2930 + 8));
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b693;
          aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b480;
          fVar2 = fdb_set_log_callback
                            (*(fdb_kvs_handle **)handle_00.seqtree,logCallbackFunc,
                             "rollback_all_test");
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b68e;
          aVar20._0_4_ = aVar20._0_4_ + 1;
          aVar20._4_4_ = 0;
          aVar8.seqtree = (btree *)((long)(aVar8.seqtree + -1) + 0x37);
        } while (aVar8.seqtree != (btree *)0x0);
      }
      aVar8.seqtree = (btree *)0x0;
      handle_00.seqtree = (btree *)&aStack_2968;
      pcVar33 = (char *)&aStack_2938;
      do {
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4b2;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aaStack_2960[(long)aVar8].seqtree,&fStack_2910);
        pcVar12 = (code *)aVar20;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b677;
        if (fStack_2910.last_seqnum != 0xf) {
          aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b566;
          rollback_all_test();
        }
        if (fStack_2910.doc_count != 0xf) {
          aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b578;
          rollback_all_test();
        }
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ea;
        fVar2 = fdb_get((fdb_kvs_handle *)aaStack_2960[(long)aVar8].seqtree,pfStack_2838);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b672;
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b512;
        fVar2 = fdb_get_kv((fdb_kvs_handle *)aaStack_2960[(long)aVar8].seqtree,
                           (aaStack_28d0[0].seqtrie)->aux,
                           *(size_t *)&(aaStack_28d0[0].seqtree)->ksize,(void **)handle_00.seqtree,
                           (size_t *)pcVar33);
        pcVar12 = (code *)aStack_2968;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b684;
        pcVar30 = (char *)(aaStack_28d0[0].seqtrie)->readkey;
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b53b;
        iVar4 = bcmp(pcVar30,aStack_2968.seqtree,(size_t)aStack_2938);
        if (iVar4 != 0) goto LAB_0011b67c;
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b54b;
        free(pcVar12);
        uVar27 = uStack_297c;
        aVar8.seqtree = (btree *)&(aVar8.seqtree)->vsize;
        aVar20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar12;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar17.seqtree != aVar8.seqtree);
      aVar20.seqtree = (btree *)0x0;
      pcVar30 = (char *)(ulong)uStack_297c;
      do {
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b596;
        fVar2 = fdb_set((fdb_kvs_handle *)aaStack_2960[(long)aVar20].seqtree,
                        (fdb_doc *)aaStack_28d0[0].seqtree);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b689;
        aVar20.seqtree = (btree *)&(aVar20.seqtree)->vsize;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar17.seqtree != aVar20.seqtree);
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5b5;
      fVar2 = fdb_commit(pfStack_2988,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6a2;
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5c7;
      fdb_close(pfStack_2988);
      lVar9 = 0;
      do {
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5d6;
        fdb_doc_free((fdb_doc *)aaStack_28d0[lVar9].seqtree);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x14);
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5ee;
      fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_2970,(uint64_t)pfStack_2978);
      aVar20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x14;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5fb;
        fdb_shutdown();
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b600;
        memleak_end();
        pcVar33 = "single kv mode:";
        if ((char)uVar27 != '\0') {
          pcVar33 = "multiple kv mode:";
        }
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b62e;
        sprintf(acStack_2630,"rollback all test %s",pcVar33);
        pcVar33 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar33 = "%s FAILED\n";
        }
        aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b65b;
        fprintf(_stderr,pcVar33,acStack_2630);
        return;
      }
      goto LAB_0011b6a7;
    }
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6ac;
    aVar20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x0;
    do {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b372;
      fdb_kvs_close((fdb_kvs_handle *)aaStack_2960[(long)aVar20].seqtree);
      aVar20.seqtree = aVar20.seqtree + 1;
    } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar17.seqtree != aVar20.seqtree);
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b396;
    fVar2 = fdb_open((fdb_file_handle **)&fStack_2910,"./mvcc_test6",
                     (fdb_config *)(acStack_2630 + 0x100));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b1;
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3bc;
    fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_2910.name,(fdb_kvs_handle **)&aStack_2968.seqtree
                         ,"kv0",(fdb_kvs_config *)(acStack_2930 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b6;
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3d7;
    fVar2 = fdb_rollback_all(pfStack_2988,(fdb_snapshot_marker_t)pfStack_2970->kvs);
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6bb;
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ea;
    fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_2968.seqtree);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6c0;
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ff;
    fVar2 = fdb_close((fdb_file_handle *)fStack_2910.name);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b41a;
      fVar2 = fdb_rollback_all(pfStack_2988,(fdb_snapshot_marker_t)pfStack_2970->kvs);
      goto LAB_0011b41a;
    }
  }
  else {
LAB_0011b698:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b69d;
    rollback_all_test();
LAB_0011b69d:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6a2;
    rollback_all_test();
LAB_0011b6a2:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6a7;
    rollback_all_test();
LAB_0011b6a7:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ac;
    rollback_all_test();
LAB_0011b6ac:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6b1;
    rollback_all_test();
LAB_0011b6b1:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6b6;
    rollback_all_test();
LAB_0011b6b6:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6bb;
    rollback_all_test();
LAB_0011b6bb:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c0;
    rollback_all_test();
LAB_0011b6c0:
    aStack_2998 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c5;
    rollback_all_test();
  }
  aStack_2998.seqtree = (btree *)auto_compaction_snapshots_test;
  rollback_all_test();
  aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6e7;
  aStack_29c0 = aVar20;
  aStack_29b8 = aVar8;
  aStack_29b0 = handle_00;
  phStack_29a8 = (hbtrie_func_readkey *)pcVar30;
  aStack_29a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar33;
  aStack_2998 = aVar17;
  gettimeofday(&tStack_2b18,(__timezone_ptr_t)0x0);
  aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ec;
  memleak_start();
  puVar31 = &uStack_2b5c;
  uStack_2b5c = 0;
  aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b704;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00.seqtree = (btree *)auStack_2ab8;
  aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b714;
  fdb_get_default_config();
  uStack_2a8a = 1;
  uStack_2a98 = 1;
  pcStack_2a60 = compaction_cb_count;
  uStack_2a58 = 0x20;
  uStack_2a80 = 1;
  aVar20.seqtree = (btree *)0x156054;
  aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b74e;
  puStack_2a50 = puVar31;
  fVar2 = fdb_open(&pfStack_2b68,"mvcc_test1",(fdb_config *)fconfig_00.seqtree);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00.seqtree = (btree *)afStack_2b58;
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b763;
    fdb_get_default_kvs_config();
    fStack_2b08.custom_cmp_param = afStack_2b58[0].custom_cmp_param;
    fStack_2b08.create_if_missing = afStack_2b58[0].create_if_missing;
    fStack_2b08._1_7_ = afStack_2b58[0]._1_7_;
    fStack_2b08.custom_cmp = afStack_2b58[0].custom_cmp;
    aVar20.seqtree = (btree *)&aStack_2b70;
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b788;
    fVar2 = fdb_kvs_open_default(pfStack_2b68,(fdb_kvs_handle **)aVar20.seqtree,&fStack_2b08);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba6f;
    handle_00.seqtree = (btree *)0x156958;
    aVar8.seqtree = (btree *)0x0;
    do {
      pcVar33 = (char *)0xcccccccd;
      aVar18.seqtree = (btree *)0x1565bd;
      aVar20.seqtree = (btree *)afStack_2b58;
      iVar4 = aVar8._0_4_;
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7bc;
      sprintf((char *)aVar20.seqtree,"%d",aVar8.seqtree);
      aVar17 = aStack_2b70;
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7c9;
      sVar5 = strlen((char *)aVar20.seqtree);
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e0;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar17.seqtree,aVar20.seqtree,sVar5,"value",5);
      aVar19.seqtree = handle_00.seqtree;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba28;
        auto_compaction_snapshots_test();
LAB_0011ba28:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba2d;
        auto_compaction_snapshots_test();
LAB_0011ba2d:
        fconfig_00 = aVar17;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba32;
        auto_compaction_snapshots_test();
LAB_0011ba32:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba37;
        auto_compaction_snapshots_test();
LAB_0011ba37:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba3c;
        auto_compaction_snapshots_test();
        handle_00 = aVar19;
        doc_03 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar33;
LAB_0011ba3c:
        aVar19 = handle_00;
        handle_00 = aVar18;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba41;
        auto_compaction_snapshots_test();
LAB_0011ba41:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba4e;
        auto_compaction_snapshots_test();
LAB_0011ba4e:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba5b;
        aVar20 = fconfig_00;
        auto_compaction_snapshots_test();
LAB_0011ba5b:
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba60;
        auto_compaction_snapshots_test();
        aVar17 = handle_00;
        pcVar33 = (char *)doc_03;
LAB_0011ba60:
        handle_00 = aVar19;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba65;
        auto_compaction_snapshots_test();
LAB_0011ba65:
        puVar31 = (uint *)afStack_2b58;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba6a;
        auto_compaction_snapshots_test();
        goto LAB_0011ba6a;
      }
      aVar17 = aVar8;
      if ((int)((ulong)aVar8.seqtree / 10) * 10 == iVar4) {
        aVar20.seqtree = (btree *)0x0;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80c;
        fVar2 = fdb_commit(pfStack_2b68,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba28;
      }
      fconfig_00 = aVar8;
      if ((int)((ulong)aVar8.seqtree / 100) * 100 == iVar4) {
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b83d;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aStack_2b70.seqtree,&fStack_2ae8);
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)fStack_2ae8.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba2d;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b85f;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2b70.seqtree,&pfStack_2b78,
                                  fStack_2ae8.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba37;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b885;
        fdb_doc_create((fdb_doc **)&aStack_2b80.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2b80.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b898;
        fVar2 = fdb_get_byseq(pfStack_2b78,(fdb_doc *)aStack_2b80.seqtree);
        aVar19 = aStack_2b80;
        doc_03.seqtree = (btree *)pcVar33;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba3c;
        pcVar33 = (char *)(aStack_2b80.seqtrie)->aux;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8b9;
        sVar5 = strlen(&afStack_2b58[0].create_if_missing);
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8c7;
        iVar3 = bcmp(pcVar33,afStack_2b58,sVar5);
        doc_03 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar33;
        if (iVar3 != 0) goto LAB_0011ba41;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8d7;
        fdb_doc_free((fdb_doc *)aVar19.seqtree);
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8e1;
        fVar2 = fdb_kvs_close(pfStack_2b78);
        aVar18.seqtree = handle_00.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba32;
        aVar20.seqtree = (btree *)&pfStack_2b78;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8ff;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2b70.seqtree,
                                  (fdb_kvs_handle **)aVar20.seqtree,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba5b;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b925;
        fdb_doc_create((fdb_doc **)&aStack_2b80.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2b80.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b938;
        aVar20 = aStack_2b80;
        fVar2 = fdb_get_byseq(pfStack_2b78,(fdb_doc *)aStack_2b80.seqtree);
        doc_03 = aStack_2b80;
        aVar17.seqtree = handle_00.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba60;
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(aStack_2b80.seqtrie)->aux;
        aVar20.seqtree = (btree *)afStack_2b58;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b956;
        sVar5 = strlen((char *)aVar20.seqtree);
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b964;
        iVar3 = bcmp(fconfig_00.seqtree,aVar20.seqtree,sVar5);
        if (iVar3 != 0) goto LAB_0011ba4e;
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b974;
        fdb_doc_free((fdb_doc *)doc_03.seqtree);
        aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b97e;
        fVar2 = fdb_kvs_close(pfStack_2b78);
        pcVar33 = (char *)0xcccccccd;
        aVar17.seqtree = (btree *)0x1565bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011b996;
        goto LAB_0011ba65;
      }
LAB_0011b996:
      puVar31 = (uint *)afStack_2b58;
      pcVar33 = (char *)0xcccccccd;
      aVar17.seqtree = (btree *)0x1565bd;
      aVar8._0_4_ = iVar4 + 1;
      aVar8._4_4_ = 0;
    } while (aVar8._0_4_ != 100000);
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9b0;
    fVar2 = fdb_close(pfStack_2b68);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba74;
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9bd;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9ca;
      memleak_end();
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9e4;
      sprintf(&afStack_2b58[0].create_if_missing,"auto compaction completed %d times with snapshots"
              ,(ulong)uStack_2b5c);
      pcVar33 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar33 = "%s FAILED\n";
      }
      aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba11;
      fprintf(_stderr,pcVar33,afStack_2b58);
      return;
    }
  }
  else {
LAB_0011ba6a:
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba6f;
    auto_compaction_snapshots_test();
LAB_0011ba6f:
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba74;
    auto_compaction_snapshots_test();
LAB_0011ba74:
    aStack_2b90 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba79;
    auto_compaction_snapshots_test();
  }
  aStack_2b90.seqtree = (btree *)compaction_cb_count;
  auto_compaction_snapshots_test();
  aVar19.seqtree = aVar20.seqtree & 0xffffffff;
  __tv = &tStack_2ba8;
  aStack_2bb8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba95;
  aStack_2b98 = fconfig_00;
  aStack_2b90 = aVar17;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if (aVar20._0_4_ == 0x20) {
    if (extraout_RDX_00 == 0) {
      *(int *)&(aStack_2b80.seqtree)->ksize = *(int *)&(aStack_2b80.seqtree)->ksize + 1;
      return;
    }
  }
  else {
    aStack_2bb8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bab4;
    compaction_cb_count();
  }
  aStack_2bb8.seqtree = (btree *)rollback_during_ops_test;
  compaction_cb_count();
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bad9;
  aStack_2bd8 = aVar8;
  aStack_2bd0 = handle_00;
  puStack_2bc8 = puVar31;
  aStack_2bc0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar33;
  aStack_2bb8.seqtree = aVar19.seqtree;
  gettimeofday((timeval *)(acStack_2e0f + 0x2f),(__timezone_ptr_t)0x0);
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bade;
  memleak_start();
  iStack_2e2c = 10000;
  if (__tv == (timeval *)0x0) {
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bafb;
    system("rm -rf  mvcc_test* > errorlog.txt");
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb08;
    fdb_get_default_config();
    fconfig_02 = &fStack_2cd8;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb20;
    memcpy(fconfig_02,auStack_2dd0,0xf8);
    fStack_2cd8.block_reusing_threshold = 0;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb3f;
    fVar2 = fdb_open(&pfStack_2e20,"mvcc_test1",fconfig_02);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb54;
      fdb_get_default_kvs_config();
      uStack_2de8 = uStack_2dc0;
      pcStack_2df8 = (char *)auStack_2dd0._0_8_;
      pfStack_2df0 = (fdb_config *)auStack_2dd0._8_8_;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb76;
      fVar2 = fdb_kvs_open_default
                        (pfStack_2e20,(fdb_kvs_handle **)&aStack_2e28.seqtree,
                         (fdb_kvs_config *)(acStack_2e0f + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf9d;
      if (0 < iStack_2e2c) {
        handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
        __tv = (timeval *)CONCAT71((int7)((ulong)auStack_2dd0 >> 8),1);
        uVar27 = 0;
        do {
          aVar19._0_4_ = uVar27 + 1;
          aVar19._4_4_ = 0;
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbb0;
          sprintf(acStack_2e0f,"%d",aVar19.seqtree);
          aVar8 = aStack_2e28;
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbbd;
          sVar5 = strlen(acStack_2e0f);
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd8;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar8.seqtree,acStack_2e0f,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be65;
            rollback_during_ops_test();
            goto LAB_0011be65;
          }
          ptVar14 = __tv;
          if ((int)((ulong)handle_00.seqtree / 10) * 10 - 1U == uVar27) {
            ptVar14 = (timeval *)((ulong)__tv & 0xffffffff ^ 1);
            aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc18;
            fdb_commit(pfStack_2e20,~(byte)__tv & 1);
          }
          handle_00._0_4_ = handle_00._0_4_ + 1;
          handle_00._4_4_ = 0;
          __tv = ptVar14;
          uVar27 = aVar19._0_4_;
        } while ((int)aVar19._0_4_ < iStack_2e2c);
      }
      aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc3f;
      fdb_commit(pfStack_2e20,'\x01');
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc4e;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_2e28.seqtree,(fdb_kvs_info *)auStack_2dd0);
      __tv = (timeval *)(auStack_2dd0 + 8);
      if ((fdb_config *)auStack_2dd0._8_8_ != (fdb_config *)(long)iStack_2e2c) {
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc6a;
        rollback_during_ops_test();
      }
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc82;
      pthread_create(&pStack_2e18,(pthread_attr_t *)0x0,rollback_during_ops_test,&iStack_2e2c);
      fconfig_02 = (fdb_config *)0x156958;
      pcVar33 = acStack_2e0f;
      aVar8.seqtree = (btree *)0x1565bd;
      do {
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bca4;
        sprintf(pcVar33,"%d",aVar19.seqtree);
        handle_00 = aStack_2e28;
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcb1;
        sVar5 = strlen(pcVar33);
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcc8;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pcVar33,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be65;
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bce4;
          fVar2 = fdb_commit(pfStack_2e20,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011be6a;
        }
        aVar19._0_4_ = aVar19._0_4_ + 1;
        aVar19._4_4_ = 0;
      } while (aVar19._0_4_ != 0x2711);
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd0a;
      pthread_join(pStack_2e18,(void **)(acStack_2e0f + 0xf));
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd2d;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2e28.seqtree,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa2;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd44;
      fVar2 = fdb_commit(pfStack_2e20,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa7;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd5e;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_2e28.seqtree,(fdb_kvs_info *)auStack_2dd0);
      fconfig_02 = (fdb_config *)auStack_2dd0._8_8_;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd85;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2e28.seqtree,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfac;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdb0;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2e28.seqtree,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb1;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdc7;
      fVar2 = fdb_commit(pfStack_2e20,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb6;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bddc;
      fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2e28.seqtree,(fdb_seqnum_t)fconfig_02);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdf6;
        fdb_get_kvs_info((fdb_kvs_handle *)aStack_2e28.seqtree,(fdb_kvs_info *)auStack_2dd0);
        if ((fdb_config *)auStack_2dd0._8_8_ != fconfig_02) {
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be07;
          rollback_during_ops_test();
        }
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be11;
        fdb_close(pfStack_2e20);
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be16;
        fdb_shutdown();
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be1b;
        memleak_end();
        pcVar33 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar33 = "%s FAILED\n";
        }
        aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be4c;
        fprintf(_stderr,pcVar33,"rollback during ops test");
        return;
      }
    }
    else {
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf9d;
      rollback_during_ops_test();
LAB_0011bf9d:
      __tv = (timeval *)auStack_2dd0;
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfa2;
      rollback_during_ops_test();
LAB_0011bfa2:
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfa7;
      rollback_during_ops_test();
LAB_0011bfa7:
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfac;
      rollback_during_ops_test();
LAB_0011bfac:
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb1;
      rollback_during_ops_test();
LAB_0011bfb1:
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb6;
      rollback_during_ops_test();
LAB_0011bfb6:
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfbb;
      rollback_during_ops_test();
    }
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc0;
    rollback_during_ops_test();
LAB_0011bfc0:
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc5;
    rollback_during_ops_test();
  }
  else {
LAB_0011be6f:
    fconfig_02 = (fdb_config *)auStack_2dd0;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be7c;
    fdb_get_default_config();
    pcVar33 = (char *)&fStack_2cd8;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be94;
    memcpy(pcVar33,fconfig_02,0xf8);
    fStack_2cd8.block_reusing_threshold = 0;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11beb3;
    fVar2 = fdb_open(&pfStack_2e20,"mvcc_test1",(fdb_config *)pcVar33);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfc0;
    fconfig_02 = (fdb_config *)auStack_2dd0;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bec8;
    fdb_get_default_kvs_config();
    uStack_2de8 = uStack_2dc0;
    pcStack_2df8 = (char *)auStack_2dd0._0_8_;
    pfStack_2df0 = (fdb_config *)auStack_2dd0._8_8_;
    aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11beeb;
    fVar2 = fdb_kvs_open_default
                      (pfStack_2e20,(fdb_kvs_handle **)&aStack_2e28.seqtree,
                       (fdb_kvs_config *)(acStack_2e0f + 0x17));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      iStack_2e2c = (int)__tv->tv_sec;
      if (1 < (long)iStack_2e2c) {
        handle_00.seqtree = (btree *)0xcccccccd;
        fconfig_02 = (fdb_config *)0x156958;
        pcVar33 = acStack_2e0f;
        aVar8.seqtree = (btree *)0x1565bd;
        __tv = (timeval *)(long)iStack_2e2c;
        do {
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf2c;
          sprintf(pcVar33,"%d",(ulong)__tv & 0xffffffff);
          aVar19 = aStack_2e28;
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf39;
          sVar5 = strlen(pcVar33);
          aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf50;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar19.seqtree,pcVar33,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfca;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf76;
            fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2e28.seqtree,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfcf;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf91;
      fdb_close(pfStack_2e20);
      aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf98;
      pthread_exit((void *)0x0);
    }
  }
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfca;
  rollback_during_ops_test();
LAB_0011bfca:
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfcf;
  rollback_during_ops_test();
LAB_0011bfcf:
  aStack_2e40.seqtree = (btree *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff0;
  ptStack_2e60 = __tv;
  aStack_2e58 = aVar8;
  aStack_2e50 = handle_00;
  pfStack_2e48 = fconfig_02;
  aStack_2e40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar33;
  gettimeofday((timeval *)(auStack_2fbf + 0xf),(__timezone_ptr_t)0x0);
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff5;
  memleak_start();
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c001;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_01 = &fStack_2f58;
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c011;
  fdb_get_default_config();
  aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c025;
  fVar2 = fdb_open(&pfStack_2fe0,"mvcc_test1",fconfig_01);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_01 = (fdb_config *)(auStack_2fa0 + 0x30);
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c03d;
    fdb_get_default_kvs_config();
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c04f;
    fVar2 = fdb_kvs_open_default
                      (pfStack_2fe0,(fdb_kvs_handle **)&aStack_2fe8.seqtree,
                       (fdb_kvs_config *)fconfig_01);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c270;
    fconfig_01 = (fdb_config *)0x1;
    fconfig_02 = (fdb_config *)0x156958;
    pcVar33 = auStack_2fbf;
    aVar8.seqtree = (btree *)0x1565bd;
    do {
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c07e;
      sprintf(pcVar33,"%d",fconfig_01);
      handle_00 = aStack_2fe8;
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c08b;
      sVar5 = strlen(pcVar33);
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0a2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pcVar33,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c266;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c266;
      }
      uVar27 = (int)fconfig_01 + 1;
      fconfig_01 = (fdb_config *)(ulong)uVar27;
    } while (uVar27 != 4);
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0bd;
    fdb_commit(pfStack_2fe0,'\0');
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e0;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2fe8.seqtree,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c275;
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c10b;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2fe8.seqtree,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27a;
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c122;
    fVar2 = fdb_commit(pfStack_2fe0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27f;
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c139;
    fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2fe8.seqtree,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c284;
    fconfig_01 = (fdb_config *)auStack_2fa0;
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c153;
    fdb_get_kvs_info((fdb_kvs_handle *)aStack_2fe8.seqtree,(fdb_kvs_info *)fconfig_01);
    if (auStack_2fa0._8_8_ != 3) {
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c164;
      in_memory_snapshot_rollback_test();
    }
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c17a;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2fe8.seqtree,&pfStack_2fc8,0xffffffffffffffff
                             );
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c289;
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1a2;
    fdb_iterator_init(pfStack_2fc8,&pfStack_2fd8,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_01 = (fdb_config *)&pfStack_2fd0;
    pfStack_2fd0 = (fdb_doc *)0x0;
    fconfig_02 = (fdb_config *)0x3;
    do {
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1c1;
      fVar2 = fdb_iterator_get(pfStack_2fd8,(fdb_doc **)fconfig_01);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c266;
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1d3;
      fdb_doc_free(pfStack_2fd0);
      pfStack_2fd0 = (fdb_doc *)0x0;
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1e6;
      fVar2 = fdb_iterator_next(pfStack_2fd8);
      fconfig_02 = (fdb_config *)&fconfig_02[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_02 == (fdb_config *)0x0) {
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c201;
      fdb_iterator_close(pfStack_2fd8);
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c20b;
      fdb_kvs_close(pfStack_2fc8);
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c215;
      fdb_close(pfStack_2fe0);
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c21a;
      fdb_shutdown();
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c21f;
      memleak_end();
      pcVar33 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar33 = "%s FAILED\n";
      }
      aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c250;
      fprintf(_stderr,pcVar33,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c26b:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c270;
    in_memory_snapshot_rollback_test();
LAB_0011c270:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c275;
    in_memory_snapshot_rollback_test();
LAB_0011c275:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27a;
    in_memory_snapshot_rollback_test();
LAB_0011c27a:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27f;
    in_memory_snapshot_rollback_test();
LAB_0011c27f:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c284;
    in_memory_snapshot_rollback_test();
LAB_0011c284:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c289;
    in_memory_snapshot_rollback_test();
LAB_0011c289:
    aStack_2ff8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c28e;
    in_memory_snapshot_rollback_test();
  }
  aStack_2ff8.seqtree = (btree *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_54b0 = (code *)0x11c2b0;
  pfStack_3020 = fconfig_01;
  aStack_3018 = aVar8;
  aStack_3010 = handle_00;
  pfStack_3008 = fconfig_02;
  aStack_3000 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar33;
  aStack_2ff8 = aVar19;
  gettimeofday(&tStack_5438,(__timezone_ptr_t)0x0);
  pcStack_54b0 = (code *)0x11c2b5;
  memleak_start();
  pcStack_54b0 = (code *)0x11c2c1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_54b0 = (code *)0x11c2d1;
  fdb_get_default_config();
  pcStack_54b0 = (code *)0x11c2db;
  fdb_get_default_kvs_config();
  fStack_5320.wal_threshold = 0x400;
  fStack_5320.compaction_mode = 0;
  fStack_5320.durability_opt = 2;
  pfVar11 = (fdb_kvs_handle *)(apfStack_5128 + 0x20);
  ppfVar15 = apfStack_5428;
  pcVar33 = "kvs%d";
  uVar25 = 0;
  ppfVar32 = (fdb_kvs_handle **)0x0;
  do {
    pcStack_54b0 = (code *)0x11c31b;
    sprintf((char *)ppfVar15,"mvcc_test%d",(ulong)ppfVar32 & 0xffffffff);
    pcVar30 = (char *)(apfStack_5498 + (long)ppfVar32);
    pcStack_54b0 = (code *)0x11c336;
    ppfVar24 = (fdb_kvs_handle **)pcVar30;
    fVar2 = fdb_open((fdb_file_handle **)pcVar30,(char *)ppfVar15,
                     (fdb_config *)(apfStack_5428 + 0x21));
    iVar4 = (int)ppfVar24;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c685;
    ppfVar24 = (fdb_kvs_handle **)0x0;
    ppfStack_54a8 = ppfVar32;
    pfStack_54a0 = pfVar11;
    do {
      ppfVar32 = ppfVar24;
      pcStack_54b0 = (code *)0x11c35b;
      sprintf((char *)ppfVar15,"kvs%d",(ulong)(uint)((int)ppfVar32 + (int)uVar25));
      pfVar37 = *(fdb_kvs_handle **)pcVar30;
      pcStack_54b0 = (code *)0x11c36e;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar37,(fdb_kvs_handle **)pfVar11,(char *)ppfVar15,
                           (fdb_kvs_config *)(apfStack_5498 + 9));
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_54b0 = (code *)0x11c67b;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c67b;
      }
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).custom_cmp;
      ppfVar24 = (fdb_kvs_handle **)((long)ppfVar32 + 1);
    } while ((char *)((long)ppfVar32 + 1) != (char *)0x80);
    ppfVar32 = (fdb_kvs_handle **)((long)ppfStack_54a8 + 1);
    uVar25 = uVar25 + 0x80;
    pfVar11 = (fdb_kvs_handle *)&pfStack_54a0[1].bub_ctx.space_used;
  } while (ppfVar32 != (fdb_kvs_handle **)0x8);
  ppfVar32 = apfStack_5428 + 0x40;
  ppfVar15 = apfStack_5128;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    uVar25 = 0;
    do {
      pcStack_54b0 = (code *)0x11c3cf;
      sprintf((char *)ppfVar32,"key%08d",uVar25);
      pcStack_54b0 = (code *)0x11c3e2;
      sprintf((char *)ppfVar15,"value%08d",uVar25);
      pcVar33 = (char *)apfStack_5128[(long)&pfVar11->op_stats];
      pcStack_54b0 = (code *)0x11c3f2;
      sVar5 = strlen((char *)ppfVar32);
      pcVar30 = (char *)(sVar5 + 1);
      pcStack_54b0 = (code *)0x11c3fe;
      sVar5 = strlen((char *)ppfVar15);
      pcStack_54b0 = (code *)0x11c413;
      pfVar37 = (fdb_kvs_handle *)pcVar33;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar33,ppfVar32,(size_t)pcVar30,ppfVar15,sVar5 + 1);
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c67b;
      uVar27 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar27;
    } while (uVar27 != 10);
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
  } while (pfVar11 != (fdb_kvs_handle *)0x400);
  pcVar30 = (char *)0x0;
  do {
    pfVar37 = apfStack_5498[(long)pcVar30];
    if (((ulong)pcVar30 & 1) == 0) {
      pcStack_54b0 = (code *)0x11c441;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\0');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a3;
    }
    else {
      pcStack_54b0 = (code *)0x11c454;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\x01');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a8;
    }
    pcVar30 = (char *)((long)pcVar30 + 1);
  } while (pcVar30 != (char *)0x8);
  pcVar30 = "key%08d";
  ppfVar32 = apfStack_5428 + 0x40;
  ppfVar15 = (fdb_kvs_handle **)0x0;
  do {
    uVar25 = 0;
    do {
      pcStack_54b0 = (code *)0x11c488;
      sprintf((char *)ppfVar32,"key%08d",uVar25);
      pfVar11 = apfStack_5128[(long)(ppfVar15 + 4)];
      pcStack_54b0 = (code *)0x11c498;
      sVar5 = strlen((char *)ppfVar32);
      pcStack_54b0 = (code *)0x11c4a7;
      pfVar37 = pfVar11;
      fVar2 = fdb_del_kv(pfVar11,ppfVar32,sVar5 + 1);
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c680;
      uVar27 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar27;
    } while (uVar27 != 10);
    ppfVar15 = (fdb_kvs_handle **)((long)ppfVar15 + 1);
  } while (ppfVar15 != (fdb_kvs_handle **)0x400);
  pcVar30 = (char *)0x0;
  do {
    pfVar37 = apfStack_5498[(long)pcVar30];
    if (((ulong)pcVar30 & 1) == 0) {
      pcStack_54b0 = (code *)0x11c4d5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\0');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6ad;
    }
    else {
      pcStack_54b0 = (code *)0x11c4e8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\x01');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b2;
    }
    pcVar30 = (char *)((long)pcVar30 + 1);
  } while (pcVar30 != (char *)0x8);
  ppfVar32 = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar30 = (char *)(apfStack_5128 + 0x20);
  do {
    pcStack_54b0 = (code *)0x11c515;
    ppfVar24 = (fdb_kvs_handle **)pcVar30;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar30,10);
    iVar4 = (int)ppfVar24;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68a;
    ppfVar32 = ppfVar32 + 8;
    pcVar30 = (char *)((long)pcVar30 + 0x200);
  } while (ppfVar32 < (fdb_kvs_handle **)0x3c0);
  ppfVar15 = apfStack_5498;
  pcVar30 = "kvs%d";
  ppfVar32 = apfStack_5428;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    pfVar37 = apfStack_5128[(long)&pfVar11->op_stats];
    pcStack_54b0 = (code *)0x11c555;
    fVar2 = fdb_kvs_close(pfVar37);
    iVar4 = (int)pfVar37;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c694;
    pcStack_54b0 = (code *)0x11c56d;
    sprintf((char *)ppfVar32,"kvs%d",(ulong)pfVar11 & 0xffffffff);
    pfVar37 = *ppfVar15;
    pcStack_54b0 = (code *)0x11c579;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar37,(char *)ppfVar32);
    iVar4 = (int)pfVar37;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68f;
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->config).wal_threshold;
    ppfVar15 = ppfVar15 + 1;
  } while (pfVar11 != (fdb_kvs_handle *)0x400);
  pcVar30 = (char *)0x0;
  do {
    pfVar37 = apfStack_5498[(long)pcVar30];
    if (((ulong)pcVar30 & 1) == 0) {
      pcStack_54b0 = (code *)0x11c5a5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\0');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b7;
    }
    else {
      pcStack_54b0 = (code *)0x11c5b8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\x01');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6bc;
    }
    pcVar30 = (char *)((long)pcVar30 + 1);
  } while (pcVar30 != (char *)0x8);
  pcVar30 = "mvcc_test_compact%d";
  ppfVar32 = apfStack_5428;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_54b0 = (code *)0x11c5eb;
    sprintf((char *)ppfVar32,"mvcc_test_compact%d",(ulong)pfVar11 & 0xffffffff);
    pfVar37 = apfStack_5498[(long)pfVar11];
    pcStack_54b0 = (code *)0x11c5f8;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar37,(char *)ppfVar32);
    iVar4 = (int)pfVar37;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c699;
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
  } while (pfVar11 != (fdb_kvs_handle *)0x8);
  pcVar30 = (char *)0x0;
  pcStack_54b0 = (code *)0x11c612;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar37 = apfStack_5498[(long)pcVar30];
    pcStack_54b0 = (code *)0x11c61c;
    fVar2 = fdb_close((fdb_file_handle *)pfVar37);
    iVar4 = (int)pfVar37;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar30 = (char *)((long)pcVar30 + 1);
    if (pcVar30 == (char *)0x8) {
      pcStack_54b0 = (code *)0x11c62e;
      fdb_shutdown();
      pcStack_54b0 = (code *)0x11c633;
      memleak_end();
      pcVar33 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar33 = "%s FAILED\n";
      }
      pcStack_54b0 = (code *)0x11c664;
      fprintf(_stderr,pcVar33,"open multi files kvs test");
      return;
    }
  }
LAB_0011c69e:
  pcStack_54b0 = (code *)0x11c6a3;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a3:
  pcStack_54b0 = (code *)0x11c6a8;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a8:
  pcStack_54b0 = (code *)0x11c6ad;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6ad:
  pcStack_54b0 = (code *)0x11c6b2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b2:
  pcStack_54b0 = (code *)0x11c6b7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b7:
  pcStack_54b0 = (code *)0x11c6bc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6bc:
  pcStack_54b0 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_59b8 = (code *)0x11c6e3;
  ppfStack_54d8 = (fdb_kvs_handle **)pcVar30;
  ppfStack_54d0 = ppfVar15;
  pfStack_54c8 = (fdb_kvs_handle *)pcVar33;
  ppfStack_54c0 = ppfVar32;
  pfStack_54b8 = pfVar11;
  pcStack_54b0 = (code *)uVar25;
  gettimeofday(&tStack_5930,(__timezone_ptr_t)0x0);
  pcStack_59b8 = (code *)0x11c6e8;
  memleak_start();
  pcStack_59b8 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_59b8 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  fStack_55d0.flags = 1;
  fStack_55d0.block_reusing_threshold = 0;
  fStack_55d0.seqtree_opt = 0;
  pcStack_59b8 = (code *)0x11c728;
  fStack_55d0.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_59b8 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&pfStack_59a0,"./mvcc_test1",(fdb_config *)(acStack_56d0 + 0x100));
  iStack_597c = iVar4;
  if (iVar4 == 0) {
    pcStack_59b8 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_59a0,apfStack_5970,&fStack_5950);
    pcVar33 = (char *)0x1;
  }
  else {
    ppfVar15 = apfStack_5970;
    uVar25 = 0;
    do {
      pcStack_59b8 = (code *)0x11c76d;
      sprintf(acStack_5938,"kv%d",uVar25 & 0xffffffff);
      pcStack_59b8 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)pfStack_59a0,ppfVar15,acStack_5938,&fStack_5950);
      uVar25 = uVar25 + 1;
      ppfVar15 = ppfVar15 + 1;
    } while (uVar25 != 3);
    pcVar33 = (char *)0x3;
  }
  uStack_59a4 = 0;
  do {
    uVar25 = 0;
    do {
      pcStack_59b8 = (code *)0x11c7d4;
      sprintf(acStack_57d0,"key%d",uVar25 & 0xffffffff);
      pcStack_59b8 = (code *)0x11c7f5;
      sprintf(acStack_5920,"meta-%d-%d",(ulong)uStack_59a4,uVar25 & 0xffffffff);
      pcStack_59b8 = (code *)0x11c814;
      sprintf(acStack_56d0,"body-%d-%d",(ulong)uStack_59a4,uVar25 & 0xffffffff);
      doc_00 = (btree *)(&bStack_5820.ksize + uVar25 * 8);
      pcStack_59b8 = (code *)0x11c827;
      sVar5 = strlen(acStack_57d0);
      pcStack_59b8 = (code *)0x11c837;
      metalen._M_i = strlen(acStack_5920);
      pcStack_59b8 = (code *)0x11c842;
      sVar6 = strlen(acStack_56d0);
      pcStack_59b8 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc_00,acStack_57d0,sVar5,acStack_5920,metalen._M_i,acStack_56d0,
                     sVar6);
      pfVar11 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_59b8 = (code *)0x11c878;
        fdb_set(apfStack_5970[(long)pfVar11],*(fdb_doc **)doc_00);
        pfVar11 = (fdb_kvs_handle *)((long)pfVar11 + 1);
      } while ((fdb_kvs_handle *)pcVar33 != pfVar11);
      pcStack_59b8 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&bStack_5820.ksize + uVar25 * 8));
      uVar25 = uVar25 + 1;
    } while (uVar25 != 10);
    pcStack_59b8 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)pfStack_59a0,~(byte)uStack_59a4 & 1);
    uStack_59a4 = uStack_59a4 + 1;
    pcVar30 = (char *)(ulong)uStack_59a4;
  } while (uStack_59a4 != 5);
  pcStack_59b8 = (code *)0x11c8d4;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_59a0,&pfStack_5988,&uStack_5958);
  pfVar37 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_59b8 = (code *)0x11c8f3;
    fVar2 = fdb_rollback(apfStack_5970,(pfStack_5988[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
    pfStack_5998 = (fdb_kvs_handle *)0x0;
    pcVar30 = acStack_56d0;
    pfVar37 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_59b8 = (code *)0x11c928;
      fVar2 = fdb_snapshot_open(apfStack_5970[(long)pfVar37],&pfStack_5978,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
        pcStack_59b8 = (code *)0x11cbbe;
        rollback_without_seqtree();
LAB_0011cbbe:
        pcStack_59b8 = (code *)0x11cbc3;
        rollback_without_seqtree();
LAB_0011cbc3:
        pcStack_59b8 = (code *)0x11cbc8;
        rollback_without_seqtree();
LAB_0011cbc8:
        pcStack_59b8 = (code *)0x11cbcd;
        rollback_without_seqtree();
        goto LAB_0011cbcd;
      }
      pcStack_59b8 = (code *)0x11c950;
      fVar2 = fdb_iterator_init(pfStack_5978,&pfStack_5990,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
        pcStack_59b8 = (code *)0x11cbb9;
        rollback_without_seqtree();
        goto LAB_0011cbb9;
      }
      metalen._M_i = 0;
      do {
        pcStack_59b8 = (code *)0x11c96a;
        fVar2 = fdb_iterator_get(pfStack_5990,(fdb_doc **)&pfStack_5998);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
          pcStack_59b8 = (code *)0x11cb94;
          rollback_without_seqtree();
LAB_0011cb94:
          pcStack_59b8 = (code *)0x11cba4;
          rollback_without_seqtree();
LAB_0011cba4:
          pcStack_59b8 = (code *)0x11cbb4;
          rollback_without_seqtree();
          goto LAB_0011cbb4;
        }
        pcStack_59b8 = (code *)0x11c98b;
        sprintf(acStack_57d0,"key%d",metalen._M_i);
        if (pfVar37 == (fdb_kvs_handle *)0x0) {
          pcStack_59b8 = (code *)0x11c9da;
          sprintf(acStack_5920,"meta-1-%d",metalen._M_i);
          pcStack_59b8 = (code *)0x11c9ee;
          sprintf(pcVar30,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_59b8 = (code *)0x11c9ae;
          sprintf(acStack_5920,"meta-%d-%d",4,metalen._M_i);
          pcStack_59b8 = (code *)0x11c9c7;
          sprintf(pcVar30,"body-%d-%d",4);
        }
        pfVar11 = pfStack_5998;
        doc_00 = (btree *)pfStack_5998->op_stats;
        pcStack_59b8 = (code *)0x11ca0a;
        iVar4 = bcmp(doc_00,acStack_57d0,*(size_t *)&pfStack_5998->kvs_config);
        if (iVar4 != 0) {
          pcStack_59b8 = (code *)0x11cb8f;
          rollback_without_seqtree();
          goto LAB_0011cb8f;
        }
        doc_00 = pfVar11->staletree;
        pcStack_59b8 = (code *)0x11ca2a;
        iVar4 = bcmp(doc_00,acStack_5920,(size_t)(pfVar11->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_0011cba4;
        doc_00 = (pfVar11->field_6).seqtree;
        pcStack_59b8 = (code *)0x11ca45;
        iVar4 = bcmp(doc_00,pcVar30,(size_t)(pfVar11->kvs_config).custom_cmp_param);
        if (iVar4 != 0) goto LAB_0011cb94;
        pcStack_59b8 = (code *)0x11ca55;
        fdb_doc_free((fdb_doc *)pfVar11);
        pfStack_5998 = (fdb_kvs_handle *)0x0;
        uVar27 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar27;
        pcStack_59b8 = (code *)0x11ca6b;
        fVar2 = fdb_iterator_next(pfStack_5990);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar27 != 10) goto LAB_0011cbbe;
      pcStack_59b8 = (code *)0x11ca88;
      fVar2 = fdb_iterator_close(pfStack_5990);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
      pcStack_59b8 = (code *)0x11ca9a;
      fVar2 = fdb_kvs_close(pfStack_5978);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
      pfVar37 = (fdb_kvs_handle *)&(pfVar37->kvs_config).field_0x1;
    } while (pfVar37 != (fdb_kvs_handle *)pcVar33);
    pcVar30 = (char *)0x0;
    do {
      pcStack_59b8 = (code *)0x11caba;
      fVar2 = fdb_kvs_close(apfStack_5970[(long)pcVar30]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
      pcVar30 = pcVar30 + 1;
    } while (pcVar33 != pcVar30);
    pcStack_59b8 = (code *)0x11cadd;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_59a0,pfStack_5988[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
    pcStack_59b8 = (code *)0x11caf4;
    fVar2 = fdb_free_snap_markers(pfStack_5988,uStack_5958);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_59b8 = (code *)0x11cb06;
      fdb_close((fdb_file_handle *)pfStack_59a0);
      pcStack_59b8 = (code *)0x11cb0b;
      fdb_shutdown();
      pcStack_59b8 = (code *)0x11cb10;
      memleak_end();
      pcVar33 = "single kv mode:";
      if ((char)iStack_597c != '\0') {
        pcVar33 = "multiple kv mode:";
      }
      pcStack_59b8 = (code *)0x11cb40;
      sprintf(acStack_56d0,"rollback without seqtree in %s",pcVar33);
      pcVar33 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar33 = "%s FAILED\n";
      }
      pcStack_59b8 = (code *)0x11cb6d;
      fprintf(_stderr,pcVar33,acStack_56d0);
      return;
    }
  }
  else {
LAB_0011cbd2:
    pcStack_59b8 = (code *)0x11cbd7;
    rollback_without_seqtree();
LAB_0011cbd7:
    pcStack_59b8 = (code *)0x11cbdc;
    rollback_without_seqtree();
LAB_0011cbdc:
    pcStack_59b8 = (code *)0x11cbe1;
    rollback_without_seqtree();
  }
  pcStack_59b8 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_5b90 = (fdb_kvs_handle *)0x11cc03;
  pcStack_59e0 = pcVar30;
  aStack_59d8.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_59d0 = doc_00;
  pfStack_59c8 = pfVar11;
  pfStack_59c0 = pfVar37;
  pcStack_59b8 = (code *)pcVar33;
  gettimeofday(&tStack_5b30,(__timezone_ptr_t)0x0);
  pfStack_5b90 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_5b90 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar33 = auStack_5b20 + 0x48;
  pfStack_5b90 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_5b90 = (fdb_kvs_handle *)0x11cc36;
  fVar2 = fdb_open(&pfStack_5b88,"./mvcc_test2",(fdb_config *)pcVar33);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar33 = auStack_5b20;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_5b38 = (btreeblk_handle *)auStack_5b20._16_8_;
    pfStack_5b48 = (filemgr *)auStack_5b20._0_8_;
    pdStack_5b40 = (docio_handle *)auStack_5b20._8_8_;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cc6c;
    fVar2 = fdb_kvs_open_default(pfStack_5b88,&pfStack_5b80,(fdb_kvs_config *)&pfStack_5b48);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cc82;
    fVar2 = fdb_begin_transaction(pfStack_5b88,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar33 = "key%d";
    pfVar11 = (fdb_kvs_handle *)acStack_5b77;
    pfVar37 = (fdb_kvs_handle *)0x1565bd;
    uVar25 = 0;
    do {
      pfStack_5b90 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar11,"key%d",uVar25);
      handle = pfStack_5b80;
      pfStack_5b90 = (fdb_kvs_handle *)0x11ccbb;
      sVar5 = strlen((char *)pfVar11);
      pfStack_5b90 = (fdb_kvs_handle *)0x11ccd2;
      fVar2 = fdb_set_kv(handle,pfVar11,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_5b90 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar27 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar27;
    } while (uVar27 != 10);
    pfStack_5b90 = (fdb_kvs_handle *)0x11ccef;
    fVar2 = fdb_end_transaction(pfStack_5b88,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_5b88,"./mvcc_test3");
    pfStack_5b90 = (fdb_kvs_handle *)0x11cd15;
    fVar2 = fdb_begin_transaction(pfStack_5b88,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar33 = "key%d";
    pfVar11 = (fdb_kvs_handle *)acStack_5b77;
    uVar27 = 0;
    do {
      pfStack_5b90 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar11,"key%d",(ulong)uVar27);
      pfVar37 = pfStack_5b80;
      pfStack_5b90 = (fdb_kvs_handle *)0x11cd47;
      sVar5 = strlen((char *)pfVar11);
      pfStack_5b90 = (fdb_kvs_handle *)0x11cd55;
      fVar2 = fdb_del_kv(pfVar37,pfVar11,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar27 = uVar27 + 1;
    } while (uVar27 != 10);
    pfStack_5b90 = (fdb_kvs_handle *)0x11cd72;
    fVar2 = fdb_get_file_info(pfStack_5b88,(fdb_file_info *)auStack_5b20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar33 = (char *)((ulong)auStack_5b20._40_8_ / (ulong)uStack_5ad4);
    pfStack_5b90 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_5b88);
    pfStack_5b90 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_5b90 = (fdb_kvs_handle *)0x11cdbe;
    iVar4 = _disk_dump("./mvcc_test3",(ulong)uStack_5ad4 * (long)pcVar33,
                       (ulong)((uStack_5ad4 >> 2) + uStack_5ad4 * 2));
    if (iVar4 < 0) goto LAB_0011cf90;
    pfStack_5b90 = (fdb_kvs_handle *)0x11cde8;
    iVar4 = _disk_dump("./mvcc_test2",((long)pcVar33 * 4 + 8) * (ulong)uStack_5ad4,
                       (ulong)(uStack_5ad4 >> 2));
    if (iVar4 < 0) goto LAB_0011cf95;
    pfStack_5b90 = (fdb_kvs_handle *)0x11ce07;
    fVar2 = fdb_open(&pfStack_5b88,"./mvcc_test3",(fdb_config *)(auStack_5b20 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar33 = (char *)&pfStack_5b68;
    pfStack_5b90 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_5b38 = pbStack_5b58;
    pfStack_5b48 = pfStack_5b68;
    pdStack_5b40 = pdStack_5b60;
    pfStack_5b90 = (fdb_kvs_handle *)0x11ce3d;
    fVar2 = fdb_kvs_open_default(pfStack_5b88,&pfStack_5b80,(fdb_kvs_config *)&pfStack_5b48);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_5b90 = (fdb_kvs_handle *)0x11ce53;
    fVar2 = fdb_begin_transaction(pfStack_5b88,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar27 = 0;
      do {
        pfStack_5b90 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_5b77,"key%d",(ulong)uVar27);
        pfVar37 = pfStack_5b80;
        pfStack_5b90 = (fdb_kvs_handle *)0x11ce85;
        sVar5 = strlen(acStack_5b77);
        pfStack_5b90 = (fdb_kvs_handle *)0x11ce93;
        fVar2 = fdb_del_kv(pfVar37,acStack_5b77,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar27 = uVar27 + 1;
      } while (uVar27 != 10);
      pfStack_5b90 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_5b88);
      pfVar37 = (fdb_kvs_handle *)&pfStack_5b68;
      uVar27 = 0;
      while( true ) {
        pfStack_5b90 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_5b77,"key%d",(ulong)uVar27);
        pfVar11 = pfStack_5b80;
        pfStack_5b90 = (fdb_kvs_handle *)0x11cedf;
        sVar5 = strlen(acStack_5b77);
        pfStack_5b90 = (fdb_kvs_handle *)0x11cef3;
        fVar2 = fdb_get_kv(pfVar11,acStack_5b77,sVar5,(void **)pfVar37,&sStack_5b50);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_5b90 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_5b68);
        uVar27 = uVar27 + 1;
        if (uVar27 == 10) {
          pfStack_5b90 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_5b88);
          pfStack_5b90 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_5b90 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar33 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar33 = "%s FAILED\n";
          }
          pfStack_5b90 = (fdb_kvs_handle *)0x11cf4c;
          fprintf(_stderr,pcVar33,"crash recover test");
          return;
        }
      }
LAB_0011cf6d:
      pfVar11 = (fdb_kvs_handle *)acStack_5b77;
      pcVar33 = "key%d";
      pfStack_5b90 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_5b90 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_5b90 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_5b90 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_5ba0 = (fdb_config *)pcVar33;
  pfStack_5b98 = pfVar11;
  pfStack_5b90 = pfVar37;
  gettimeofday(&tStack_5cc0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_5cd0 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_5ce0,"./mvcc_test1",&fStack_5c98);
  fdb_kvs_open_default(pfStack_5ce0,&pfStack_5cc8,&fStack_5cb0);
  fdb_kvs_open(pfStack_5ce0,&pfStack_5ce8,"kv",&fStack_5cb0);
  fVar2 = fdb_set_kv(pfStack_5ce8,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_5ce8,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_5ce0,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_5ce8,&pfStack_5cf0,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar2 = fdb_iterator_init(pfStack_5cf0,&pfStack_5cd8,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar2 = fdb_kvs_close(pfStack_5cf0);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar2 = fdb_kvs_close(pfStack_5ce8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar2 = fdb_kvs_remove(pfStack_5ce0,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar2 = fdb_iterator_get(pfStack_5cd8,&pfStack_5cd0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_5cd0);
    fVar2 = fdb_iterator_close(pfStack_5cd8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar2 = fdb_kvs_close(pfStack_5cf0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar2 = fdb_kvs_close(pfStack_5cc8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_5ce0);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar33 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar33 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar33,"drop kv other handle test");
        return;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void rollback_prior_to_ops(bool walflush)
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, j, n=100;
    int expected_doc_count = 0;
    int rb_seqnum;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1, *mirror_kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL, *vdoc;
    fdb_status status;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 10;
    fconfig.purging_interval = 1; // retain deletes until compaction

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);

    if(walflush){
        fdb_kvs_open(dbfile, &mirror_kv1, NULL, &kvs_config);
    } else {
        fdb_kvs_open(dbfile, &mirror_kv1, "mirror", &kvs_config);
    }

    // set n docs
    for(i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, NULL, 0);
        fdb_set(kv1, doc[i]);
        fdb_set(mirror_kv1, doc[i]);
        expected_doc_count++;
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // delete subset of recently loaded docs
    for(i=0;i<n/2;++i){
        fdb_del(kv1, doc[i]);
        fdb_del(mirror_kv1, doc[i]);
        expected_doc_count--;
        fdb_doc_free(doc[i]);
    }

    for(i=n/2;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // commit and save seqnum
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);
    rb_seqnum = info.last_seqnum;

    for (j=0;j<100;++j){
        // load some more docs but stop mirroring
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%d", n+i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                NULL, 0, NULL, 0);
            fdb_set(kv1, doc[i]);
            if( n%2 == 0){
                fdb_del(kv1, doc[i]);
            }
            fdb_doc_free(doc[i]);
        }
    }

    // commit wal or normal
    if(walflush){
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    } else {
        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    }

    // rollback
    status = fdb_rollback(&kv1, rb_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);
    fdb_get_kvs_info(mirror_kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);

    status = fdb_iterator_sequence_init(mirror_kv1, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get_metaonly(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_doc_create(&vdoc, rdoc->key, rdoc->keylen,
                              rdoc->meta, rdoc->metalen,
                              rdoc->body, rdoc->bodylen);
        status = fdb_get(kv1, vdoc);
        if (rdoc->deleted){
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        } else {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
        fdb_doc_free(vdoc);
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(it);
    fdb_kvs_close(mirror_kv1);
    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    sprintf(bodybuf, "rollback prior to ops test %s",
            walflush ? "commit with wal flush:" : "normal commit:");
    TEST_RESULT(bodybuf);
}